

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::sse2::CurveNiIntersectorK<4,4>::
     occluded_t<embree::sse2::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,4,4>,embree::sse2::Occluded1KEpilogMU<4,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined1 (*pauVar2) [12];
  Primitive *pPVar3;
  Primitive PVar4;
  undefined4 uVar5;
  int iVar6;
  Geometry *pGVar7;
  undefined1 auVar8 [16];
  undefined6 uVar9;
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  RTCFilterFunctionN p_Var29;
  RTCRayN *pRVar30;
  undefined1 (*pauVar31) [16];
  byte bVar32;
  int iVar33;
  RTCIntersectArguments *pRVar34;
  ulong uVar35;
  Geometry *pGVar36;
  long lVar37;
  long lVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  undefined4 uVar43;
  undefined8 unaff_R14;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  float fVar49;
  float fVar76;
  float fVar78;
  float fVar81;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar56 [16];
  undefined1 auVar59 [16];
  undefined1 auVar62 [16];
  undefined1 auVar65 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar50;
  float fVar77;
  float fVar79;
  undefined8 uVar80;
  float fVar82;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  short sVar83;
  float fVar84;
  float fVar85;
  float fVar109;
  float fVar111;
  vfloat4 v_1;
  undefined1 auVar86 [16];
  undefined1 auVar89 [16];
  undefined1 auVar92 [16];
  undefined1 auVar95 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar110;
  float fVar112;
  float fVar113;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar114;
  float fVar120;
  float fVar121;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar122;
  float fVar123;
  float fVar131;
  float fVar133;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar132;
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar137;
  float fVar149;
  float fVar150;
  vfloat4 v;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar162;
  float fVar165;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar163;
  float fVar164;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar189;
  float fVar192;
  undefined1 auVar173 [16];
  undefined1 auVar176 [16];
  undefined1 auVar179 [16];
  undefined1 auVar182 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  float fVar190;
  float fVar191;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar203;
  float fVar205;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar200;
  float fVar204;
  float fVar206;
  float fVar207;
  undefined1 auVar201 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar202;
  float fVar208;
  float fVar213;
  float fVar214;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar212;
  float fVar215;
  float fVar218;
  float fVar219;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  undefined1 auVar225 [16];
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar244;
  float fVar247;
  undefined1 auVar237 [16];
  float fVar251;
  undefined1 auVar240 [16];
  float fVar245;
  float fVar248;
  float fVar252;
  undefined1 auVar241 [16];
  float fVar246;
  float fVar249;
  float fVar250;
  float fVar253;
  float fVar254;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  float fVar255;
  float fVar256;
  float fVar263;
  float fVar265;
  float fVar267;
  undefined1 auVar257 [16];
  float fVar264;
  float fVar266;
  float fVar268;
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  float fVar269;
  float fVar275;
  float fVar276;
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  float fVar277;
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  float fVar278;
  float fVar279;
  float fVar280;
  float fVar281;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  float local_438;
  float fStack_434;
  float fStack_430;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  float local_3e8;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  undefined1 local_3a8 [16];
  ulong local_390;
  undefined8 local_388;
  undefined8 uStack_380;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  undefined1 (*local_318) [16];
  Precalculations *local_310;
  RTCFilterFunctionNArguments args;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_4> bhit;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  uint local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined2 uVar75;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 uVar108;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  
  PVar4 = prim[1];
  uVar40 = (ulong)(byte)PVar4;
  pPVar3 = prim + uVar40 * 0x19 + 6;
  fVar133 = *(float *)(pPVar3 + 0xc);
  uVar43 = *(undefined4 *)(ray + k * 4 + 0x30);
  fVar137 = (*(float *)(ray + k * 4) - *(float *)pPVar3) * fVar133;
  fVar149 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar3 + 4)) * fVar133;
  fVar150 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar3 + 8)) * fVar133;
  fVar122 = *(float *)(ray + k * 4 + 0x40) * fVar133;
  fVar131 = *(float *)(ray + k * 4 + 0x50) * fVar133;
  fVar133 = *(float *)(ray + k * 4 + 0x60) * fVar133;
  uVar5 = *(undefined4 *)(prim + uVar40 * 4 + 6);
  uVar108 = (undefined1)((uint)uVar5 >> 0x18);
  uVar75 = CONCAT11(uVar108,uVar108);
  uVar108 = (undefined1)((uint)uVar5 >> 0x10);
  uVar80 = CONCAT35(CONCAT21(uVar75,uVar108),CONCAT14(uVar108,uVar5));
  uVar108 = (undefined1)((uint)uVar5 >> 8);
  uVar9 = CONCAT51(CONCAT41((int)((ulong)uVar80 >> 0x20),uVar108),uVar108);
  sVar83 = CONCAT11((char)uVar5,(char)uVar5);
  uVar42 = CONCAT62(uVar9,sVar83);
  auVar88._8_4_ = 0;
  auVar88._0_8_ = uVar42;
  auVar88._12_2_ = uVar75;
  auVar88._14_2_ = uVar75;
  uVar75 = (undefined2)((ulong)uVar80 >> 0x20);
  auVar87._12_4_ = auVar88._12_4_;
  auVar87._8_2_ = 0;
  auVar87._0_8_ = uVar42;
  auVar87._10_2_ = uVar75;
  auVar86._10_6_ = auVar87._10_6_;
  auVar86._8_2_ = uVar75;
  auVar86._0_8_ = uVar42;
  uVar75 = (undefined2)uVar9;
  auVar10._4_8_ = auVar86._8_8_;
  auVar10._2_2_ = uVar75;
  auVar10._0_2_ = uVar75;
  fVar114 = (float)((int)sVar83 >> 8);
  fVar120 = (float)(auVar10._0_4_ >> 0x18);
  fVar121 = (float)(auVar86._8_4_ >> 0x18);
  uVar5 = *(undefined4 *)(prim + uVar40 * 5 + 6);
  uVar108 = (undefined1)((uint)uVar5 >> 0x18);
  uVar75 = CONCAT11(uVar108,uVar108);
  uVar108 = (undefined1)((uint)uVar5 >> 0x10);
  uVar80 = CONCAT35(CONCAT21(uVar75,uVar108),CONCAT14(uVar108,uVar5));
  uVar108 = (undefined1)((uint)uVar5 >> 8);
  uVar9 = CONCAT51(CONCAT41((int)((ulong)uVar80 >> 0x20),uVar108),uVar108);
  sVar83 = CONCAT11((char)uVar5,(char)uVar5);
  uVar42 = CONCAT62(uVar9,sVar83);
  auVar91._8_4_ = 0;
  auVar91._0_8_ = uVar42;
  auVar91._12_2_ = uVar75;
  auVar91._14_2_ = uVar75;
  uVar75 = (undefined2)((ulong)uVar80 >> 0x20);
  auVar90._12_4_ = auVar91._12_4_;
  auVar90._8_2_ = 0;
  auVar90._0_8_ = uVar42;
  auVar90._10_2_ = uVar75;
  auVar89._10_6_ = auVar90._10_6_;
  auVar89._8_2_ = uVar75;
  auVar89._0_8_ = uVar42;
  uVar75 = (undefined2)uVar9;
  auVar11._4_8_ = auVar89._8_8_;
  auVar11._2_2_ = uVar75;
  auVar11._0_2_ = uVar75;
  fVar151 = (float)((int)sVar83 >> 8);
  fVar162 = (float)(auVar11._0_4_ >> 0x18);
  fVar165 = (float)(auVar89._8_4_ >> 0x18);
  uVar5 = *(undefined4 *)(prim + uVar40 * 6 + 6);
  uVar108 = (undefined1)((uint)uVar5 >> 0x18);
  uVar75 = CONCAT11(uVar108,uVar108);
  uVar108 = (undefined1)((uint)uVar5 >> 0x10);
  uVar80 = CONCAT35(CONCAT21(uVar75,uVar108),CONCAT14(uVar108,uVar5));
  uVar108 = (undefined1)((uint)uVar5 >> 8);
  uVar9 = CONCAT51(CONCAT41((int)((ulong)uVar80 >> 0x20),uVar108),uVar108);
  sVar83 = CONCAT11((char)uVar5,(char)uVar5);
  uVar42 = CONCAT62(uVar9,sVar83);
  auVar94._8_4_ = 0;
  auVar94._0_8_ = uVar42;
  auVar94._12_2_ = uVar75;
  auVar94._14_2_ = uVar75;
  uVar75 = (undefined2)((ulong)uVar80 >> 0x20);
  auVar93._12_4_ = auVar94._12_4_;
  auVar93._8_2_ = 0;
  auVar93._0_8_ = uVar42;
  auVar93._10_2_ = uVar75;
  auVar92._10_6_ = auVar93._10_6_;
  auVar92._8_2_ = uVar75;
  auVar92._0_8_ = uVar42;
  uVar75 = (undefined2)uVar9;
  auVar12._4_8_ = auVar92._8_8_;
  auVar12._2_2_ = uVar75;
  auVar12._0_2_ = uVar75;
  fVar208 = (float)((int)sVar83 >> 8);
  fVar213 = (float)(auVar12._0_4_ >> 0x18);
  fVar214 = (float)(auVar92._8_4_ >> 0x18);
  uVar5 = *(undefined4 *)(prim + uVar40 * 0xb + 6);
  uVar108 = (undefined1)((uint)uVar5 >> 0x18);
  uVar75 = CONCAT11(uVar108,uVar108);
  uVar108 = (undefined1)((uint)uVar5 >> 0x10);
  uVar80 = CONCAT35(CONCAT21(uVar75,uVar108),CONCAT14(uVar108,uVar5));
  uVar108 = (undefined1)((uint)uVar5 >> 8);
  uVar9 = CONCAT51(CONCAT41((int)((ulong)uVar80 >> 0x20),uVar108),uVar108);
  sVar83 = CONCAT11((char)uVar5,(char)uVar5);
  uVar42 = CONCAT62(uVar9,sVar83);
  auVar97._8_4_ = 0;
  auVar97._0_8_ = uVar42;
  auVar97._12_2_ = uVar75;
  auVar97._14_2_ = uVar75;
  uVar75 = (undefined2)((ulong)uVar80 >> 0x20);
  auVar96._12_4_ = auVar97._12_4_;
  auVar96._8_2_ = 0;
  auVar96._0_8_ = uVar42;
  auVar96._10_2_ = uVar75;
  auVar95._10_6_ = auVar96._10_6_;
  auVar95._8_2_ = uVar75;
  auVar95._0_8_ = uVar42;
  uVar75 = (undefined2)uVar9;
  auVar13._4_8_ = auVar95._8_8_;
  auVar13._2_2_ = uVar75;
  auVar13._0_2_ = uVar75;
  fVar49 = (float)((int)sVar83 >> 8);
  fVar76 = (float)(auVar13._0_4_ >> 0x18);
  fVar78 = (float)(auVar95._8_4_ >> 0x18);
  fVar81 = (float)(auVar96._12_4_ >> 0x18);
  uVar5 = *(undefined4 *)(prim + uVar40 * 0xc + 6);
  uVar108 = (undefined1)((uint)uVar5 >> 0x18);
  uVar75 = CONCAT11(uVar108,uVar108);
  uVar108 = (undefined1)((uint)uVar5 >> 0x10);
  uVar80 = CONCAT35(CONCAT21(uVar75,uVar108),CONCAT14(uVar108,uVar5));
  uVar108 = (undefined1)((uint)uVar5 >> 8);
  uVar9 = CONCAT51(CONCAT41((int)((ulong)uVar80 >> 0x20),uVar108),uVar108);
  sVar83 = CONCAT11((char)uVar5,(char)uVar5);
  uVar42 = CONCAT62(uVar9,sVar83);
  auVar175._8_4_ = 0;
  auVar175._0_8_ = uVar42;
  auVar175._12_2_ = uVar75;
  auVar175._14_2_ = uVar75;
  uVar75 = (undefined2)((ulong)uVar80 >> 0x20);
  auVar174._12_4_ = auVar175._12_4_;
  auVar174._8_2_ = 0;
  auVar174._0_8_ = uVar42;
  auVar174._10_2_ = uVar75;
  auVar173._10_6_ = auVar174._10_6_;
  auVar173._8_2_ = uVar75;
  auVar173._0_8_ = uVar42;
  uVar75 = (undefined2)uVar9;
  auVar14._4_8_ = auVar173._8_8_;
  auVar14._2_2_ = uVar75;
  auVar14._0_2_ = uVar75;
  fVar197 = (float)((int)sVar83 >> 8);
  fVar203 = (float)(auVar14._0_4_ >> 0x18);
  fVar205 = (float)(auVar173._8_4_ >> 0x18);
  uVar5 = *(undefined4 *)(prim + uVar40 * 0xd + 6);
  uVar108 = (undefined1)((uint)uVar5 >> 0x18);
  uVar75 = CONCAT11(uVar108,uVar108);
  uVar108 = (undefined1)((uint)uVar5 >> 0x10);
  uVar80 = CONCAT35(CONCAT21(uVar75,uVar108),CONCAT14(uVar108,uVar5));
  uVar108 = (undefined1)((uint)uVar5 >> 8);
  uVar9 = CONCAT51(CONCAT41((int)((ulong)uVar80 >> 0x20),uVar108),uVar108);
  sVar83 = CONCAT11((char)uVar5,(char)uVar5);
  uVar42 = CONCAT62(uVar9,sVar83);
  auVar178._8_4_ = 0;
  auVar178._0_8_ = uVar42;
  auVar178._12_2_ = uVar75;
  auVar178._14_2_ = uVar75;
  uVar75 = (undefined2)((ulong)uVar80 >> 0x20);
  auVar177._12_4_ = auVar178._12_4_;
  auVar177._8_2_ = 0;
  auVar177._0_8_ = uVar42;
  auVar177._10_2_ = uVar75;
  auVar176._10_6_ = auVar177._10_6_;
  auVar176._8_2_ = uVar75;
  auVar176._0_8_ = uVar42;
  uVar75 = (undefined2)uVar9;
  auVar15._4_8_ = auVar176._8_8_;
  auVar15._2_2_ = uVar75;
  auVar15._0_2_ = uVar75;
  fVar220 = (float)((int)sVar83 >> 8);
  fVar221 = (float)(auVar15._0_4_ >> 0x18);
  fVar222 = (float)(auVar176._8_4_ >> 0x18);
  uVar5 = *(undefined4 *)(prim + uVar40 * 0x12 + 6);
  uVar108 = (undefined1)((uint)uVar5 >> 0x18);
  uVar75 = CONCAT11(uVar108,uVar108);
  uVar108 = (undefined1)((uint)uVar5 >> 0x10);
  uVar80 = CONCAT35(CONCAT21(uVar75,uVar108),CONCAT14(uVar108,uVar5));
  uVar108 = (undefined1)((uint)uVar5 >> 8);
  uVar9 = CONCAT51(CONCAT41((int)((ulong)uVar80 >> 0x20),uVar108),uVar108);
  sVar83 = CONCAT11((char)uVar5,(char)uVar5);
  uVar42 = CONCAT62(uVar9,sVar83);
  auVar181._8_4_ = 0;
  auVar181._0_8_ = uVar42;
  auVar181._12_2_ = uVar75;
  auVar181._14_2_ = uVar75;
  uVar75 = (undefined2)((ulong)uVar80 >> 0x20);
  auVar180._12_4_ = auVar181._12_4_;
  auVar180._8_2_ = 0;
  auVar180._0_8_ = uVar42;
  auVar180._10_2_ = uVar75;
  auVar179._10_6_ = auVar180._10_6_;
  auVar179._8_2_ = uVar75;
  auVar179._0_8_ = uVar42;
  uVar75 = (undefined2)uVar9;
  auVar16._4_8_ = auVar179._8_8_;
  auVar16._2_2_ = uVar75;
  auVar16._0_2_ = uVar75;
  fVar215 = (float)((int)sVar83 >> 8);
  fVar218 = (float)(auVar16._0_4_ >> 0x18);
  fVar219 = (float)(auVar179._8_4_ >> 0x18);
  uVar5 = *(undefined4 *)(prim + uVar40 * 0x13 + 6);
  uVar108 = (undefined1)((uint)uVar5 >> 0x18);
  uVar75 = CONCAT11(uVar108,uVar108);
  uVar108 = (undefined1)((uint)uVar5 >> 0x10);
  uVar80 = CONCAT35(CONCAT21(uVar75,uVar108),CONCAT14(uVar108,uVar5));
  uVar108 = (undefined1)((uint)uVar5 >> 8);
  uVar9 = CONCAT51(CONCAT41((int)((ulong)uVar80 >> 0x20),uVar108),uVar108);
  sVar83 = CONCAT11((char)uVar5,(char)uVar5);
  uVar42 = CONCAT62(uVar9,sVar83);
  auVar184._8_4_ = 0;
  auVar184._0_8_ = uVar42;
  auVar184._12_2_ = uVar75;
  auVar184._14_2_ = uVar75;
  uVar75 = (undefined2)((ulong)uVar80 >> 0x20);
  auVar183._12_4_ = auVar184._12_4_;
  auVar183._8_2_ = 0;
  auVar183._0_8_ = uVar42;
  auVar183._10_2_ = uVar75;
  auVar182._10_6_ = auVar183._10_6_;
  auVar182._8_2_ = uVar75;
  auVar182._0_8_ = uVar42;
  uVar75 = (undefined2)uVar9;
  auVar17._4_8_ = auVar182._8_8_;
  auVar17._2_2_ = uVar75;
  auVar17._0_2_ = uVar75;
  fVar223 = (float)((int)sVar83 >> 8);
  fVar226 = (float)(auVar17._0_4_ >> 0x18);
  fVar228 = (float)(auVar182._8_4_ >> 0x18);
  fVar231 = (float)(auVar183._12_4_ >> 0x18);
  uVar5 = *(undefined4 *)(prim + uVar40 * 0x14 + 6);
  uVar108 = (undefined1)((uint)uVar5 >> 0x18);
  uVar75 = CONCAT11(uVar108,uVar108);
  uVar108 = (undefined1)((uint)uVar5 >> 0x10);
  uVar80 = CONCAT35(CONCAT21(uVar75,uVar108),CONCAT14(uVar108,uVar5));
  uVar108 = (undefined1)((uint)uVar5 >> 8);
  uVar9 = CONCAT51(CONCAT41((int)((ulong)uVar80 >> 0x20),uVar108),uVar108);
  sVar83 = CONCAT11((char)uVar5,(char)uVar5);
  uVar42 = CONCAT62(uVar9,sVar83);
  auVar239._8_4_ = 0;
  auVar239._0_8_ = uVar42;
  auVar239._12_2_ = uVar75;
  auVar239._14_2_ = uVar75;
  uVar75 = (undefined2)((ulong)uVar80 >> 0x20);
  auVar238._12_4_ = auVar239._12_4_;
  auVar238._8_2_ = 0;
  auVar238._0_8_ = uVar42;
  auVar238._10_2_ = uVar75;
  auVar237._10_6_ = auVar238._10_6_;
  auVar237._8_2_ = uVar75;
  auVar237._0_8_ = uVar42;
  uVar75 = (undefined2)uVar9;
  auVar18._4_8_ = auVar237._8_8_;
  auVar18._2_2_ = uVar75;
  auVar18._0_2_ = uVar75;
  fVar84 = (float)((int)sVar83 >> 8);
  fVar109 = (float)(auVar18._0_4_ >> 0x18);
  fVar111 = (float)(auVar237._8_4_ >> 0x18);
  fVar255 = fVar122 * fVar114 + fVar131 * fVar151 + fVar133 * fVar208;
  fVar263 = fVar122 * fVar120 + fVar131 * fVar162 + fVar133 * fVar213;
  fVar265 = fVar122 * fVar121 + fVar131 * fVar165 + fVar133 * fVar214;
  fVar267 = fVar122 * (float)(auVar87._12_4_ >> 0x18) +
            fVar131 * (float)(auVar90._12_4_ >> 0x18) + fVar133 * (float)(auVar93._12_4_ >> 0x18);
  fVar234 = fVar122 * fVar49 + fVar131 * fVar197 + fVar133 * fVar220;
  fVar244 = fVar122 * fVar76 + fVar131 * fVar203 + fVar133 * fVar221;
  fVar247 = fVar122 * fVar78 + fVar131 * fVar205 + fVar133 * fVar222;
  fVar251 = fVar122 * fVar81 +
            fVar131 * (float)(auVar174._12_4_ >> 0x18) + fVar133 * (float)(auVar177._12_4_ >> 0x18);
  fVar170 = fVar122 * fVar215 + fVar131 * fVar223 + fVar133 * fVar84;
  fVar189 = fVar122 * fVar218 + fVar131 * fVar226 + fVar133 * fVar109;
  fVar192 = fVar122 * fVar219 + fVar131 * fVar228 + fVar133 * fVar111;
  fVar122 = fVar122 * (float)(auVar180._12_4_ >> 0x18) +
            fVar131 * fVar231 + fVar133 * (float)(auVar238._12_4_ >> 0x18);
  fVar151 = fVar114 * fVar137 + fVar151 * fVar149 + fVar208 * fVar150;
  fVar162 = fVar120 * fVar137 + fVar162 * fVar149 + fVar213 * fVar150;
  fVar165 = fVar121 * fVar137 + fVar165 * fVar149 + fVar214 * fVar150;
  fVar208 = (float)(auVar87._12_4_ >> 0x18) * fVar137 +
            (float)(auVar90._12_4_ >> 0x18) * fVar149 + (float)(auVar93._12_4_ >> 0x18) * fVar150;
  fVar214 = fVar49 * fVar137 + fVar197 * fVar149 + fVar220 * fVar150;
  fVar220 = fVar76 * fVar137 + fVar203 * fVar149 + fVar221 * fVar150;
  fVar221 = fVar78 * fVar137 + fVar205 * fVar149 + fVar222 * fVar150;
  fVar222 = fVar81 * fVar137 +
            (float)(auVar174._12_4_ >> 0x18) * fVar149 + (float)(auVar177._12_4_ >> 0x18) * fVar150;
  fVar197 = fVar137 * fVar215 + fVar149 * fVar223 + fVar150 * fVar84;
  fVar203 = fVar137 * fVar218 + fVar149 * fVar226 + fVar150 * fVar109;
  fVar205 = fVar137 * fVar219 + fVar149 * fVar228 + fVar150 * fVar111;
  fVar213 = fVar137 * (float)(auVar180._12_4_ >> 0x18) +
            fVar149 * fVar231 + fVar150 * (float)(auVar238._12_4_ >> 0x18);
  fVar133 = (float)DAT_01f4bd50;
  fVar84 = DAT_01f4bd50._4_4_;
  fVar109 = DAT_01f4bd50._8_4_;
  fVar111 = DAT_01f4bd50._12_4_;
  uVar44 = -(uint)(fVar133 <= ABS(fVar255));
  uVar45 = -(uint)(fVar84 <= ABS(fVar263));
  uVar46 = -(uint)(fVar109 <= ABS(fVar265));
  uVar47 = -(uint)(fVar111 <= ABS(fVar267));
  auVar257._0_4_ = (uint)fVar255 & uVar44;
  auVar257._4_4_ = (uint)fVar263 & uVar45;
  auVar257._8_4_ = (uint)fVar265 & uVar46;
  auVar257._12_4_ = (uint)fVar267 & uVar47;
  auVar138._0_4_ = ~uVar44 & (uint)fVar133;
  auVar138._4_4_ = ~uVar45 & (uint)fVar84;
  auVar138._8_4_ = ~uVar46 & (uint)fVar109;
  auVar138._12_4_ = ~uVar47 & (uint)fVar111;
  auVar138 = auVar138 | auVar257;
  uVar44 = -(uint)(fVar133 <= ABS(fVar234));
  uVar45 = -(uint)(fVar84 <= ABS(fVar244));
  uVar46 = -(uint)(fVar109 <= ABS(fVar247));
  uVar47 = -(uint)(fVar111 <= ABS(fVar251));
  auVar240._0_4_ = (uint)fVar234 & uVar44;
  auVar240._4_4_ = (uint)fVar244 & uVar45;
  auVar240._8_4_ = (uint)fVar247 & uVar46;
  auVar240._12_4_ = (uint)fVar251 & uVar47;
  auVar154._0_4_ = ~uVar44 & (uint)fVar133;
  auVar154._4_4_ = ~uVar45 & (uint)fVar84;
  auVar154._8_4_ = ~uVar46 & (uint)fVar109;
  auVar154._12_4_ = ~uVar47 & (uint)fVar111;
  auVar154 = auVar154 | auVar240;
  uVar44 = -(uint)(fVar133 <= ABS(fVar170));
  uVar45 = -(uint)(fVar84 <= ABS(fVar189));
  uVar46 = -(uint)(fVar109 <= ABS(fVar192));
  uVar47 = -(uint)(fVar111 <= ABS(fVar122));
  auVar185._0_4_ = (uint)fVar170 & uVar44;
  auVar185._4_4_ = (uint)fVar189 & uVar45;
  auVar185._8_4_ = (uint)fVar192 & uVar46;
  auVar185._12_4_ = (uint)fVar122 & uVar47;
  auVar216._0_4_ = ~uVar44 & (uint)fVar133;
  auVar216._4_4_ = ~uVar45 & (uint)fVar84;
  auVar216._8_4_ = ~uVar46 & (uint)fVar109;
  auVar216._12_4_ = ~uVar47 & (uint)fVar111;
  auVar216 = auVar216 | auVar185;
  auVar51 = rcpps(_DAT_01f4bd50,auVar138);
  fVar133 = auVar51._0_4_;
  fVar111 = auVar51._4_4_;
  fVar121 = auVar51._8_4_;
  fVar137 = auVar51._12_4_;
  fVar133 = (1.0 - auVar138._0_4_ * fVar133) * fVar133 + fVar133;
  fVar111 = (1.0 - auVar138._4_4_ * fVar111) * fVar111 + fVar111;
  fVar121 = (1.0 - auVar138._8_4_ * fVar121) * fVar121 + fVar121;
  fVar137 = (1.0 - auVar138._12_4_ * fVar137) * fVar137 + fVar137;
  auVar51 = rcpps(auVar51,auVar154);
  fVar84 = auVar51._0_4_;
  fVar114 = auVar51._4_4_;
  fVar122 = auVar51._8_4_;
  fVar149 = auVar51._12_4_;
  fVar84 = (1.0 - auVar154._0_4_ * fVar84) * fVar84 + fVar84;
  fVar114 = (1.0 - auVar154._4_4_ * fVar114) * fVar114 + fVar114;
  fVar122 = (1.0 - auVar154._8_4_ * fVar122) * fVar122 + fVar122;
  fVar149 = (1.0 - auVar154._12_4_ * fVar149) * fVar149 + fVar149;
  auVar51 = rcpps(auVar51,auVar216);
  fVar109 = auVar51._0_4_;
  fVar120 = auVar51._4_4_;
  fVar131 = auVar51._8_4_;
  fVar150 = auVar51._12_4_;
  fVar109 = (1.0 - auVar216._0_4_ * fVar109) * fVar109 + fVar109;
  fVar120 = (1.0 - auVar216._4_4_ * fVar120) * fVar120 + fVar120;
  fVar131 = (1.0 - auVar216._8_4_ * fVar131) * fVar131 + fVar131;
  fVar150 = (1.0 - auVar216._12_4_ * fVar150) * fVar150 + fVar150;
  uVar42 = *(ulong *)(prim + uVar40 * 7 + 6);
  uVar75 = (undefined2)(uVar42 >> 0x30);
  auVar51._8_4_ = 0;
  auVar51._0_8_ = uVar42;
  auVar51._12_2_ = uVar75;
  auVar51._14_2_ = uVar75;
  uVar75 = (undefined2)(uVar42 >> 0x20);
  auVar52._12_4_ = auVar51._12_4_;
  auVar52._8_2_ = 0;
  auVar52._0_8_ = uVar42;
  auVar52._10_2_ = uVar75;
  auVar156._10_6_ = auVar52._10_6_;
  auVar156._8_2_ = uVar75;
  auVar156._0_8_ = uVar42;
  uVar75 = (undefined2)(uVar42 >> 0x10);
  auVar19._4_8_ = auVar156._8_8_;
  auVar19._2_2_ = uVar75;
  auVar19._0_2_ = uVar75;
  auVar139._0_8_ =
       CONCAT44(((float)(auVar19._0_4_ >> 0x10) - fVar162) * fVar111,
                ((float)(int)(short)uVar42 - fVar151) * fVar133);
  auVar139._8_4_ = ((float)(auVar156._8_4_ >> 0x10) - fVar165) * fVar121;
  auVar139._12_4_ = ((float)(auVar52._12_4_ >> 0x10) - fVar208) * fVar137;
  uVar42 = *(ulong *)(prim + uVar40 * 9 + 6);
  uVar75 = (undefined2)(uVar42 >> 0x30);
  auVar55._8_4_ = 0;
  auVar55._0_8_ = uVar42;
  auVar55._12_2_ = uVar75;
  auVar55._14_2_ = uVar75;
  uVar75 = (undefined2)(uVar42 >> 0x20);
  auVar54._12_4_ = auVar55._12_4_;
  auVar54._8_2_ = 0;
  auVar54._0_8_ = uVar42;
  auVar54._10_2_ = uVar75;
  auVar53._10_6_ = auVar54._10_6_;
  auVar53._8_2_ = uVar75;
  auVar53._0_8_ = uVar42;
  uVar75 = (undefined2)(uVar42 >> 0x10);
  auVar20._4_8_ = auVar53._8_8_;
  auVar20._2_2_ = uVar75;
  auVar20._0_2_ = uVar75;
  auVar186._0_4_ = ((float)(int)(short)uVar42 - fVar151) * fVar133;
  auVar186._4_4_ = ((float)(auVar20._0_4_ >> 0x10) - fVar162) * fVar111;
  auVar186._8_4_ = ((float)(auVar53._8_4_ >> 0x10) - fVar165) * fVar121;
  auVar186._12_4_ = ((float)(auVar54._12_4_ >> 0x10) - fVar208) * fVar137;
  uVar42 = *(ulong *)(prim + uVar40 * 0xe + 6);
  uVar75 = (undefined2)(uVar42 >> 0x30);
  auVar58._8_4_ = 0;
  auVar58._0_8_ = uVar42;
  auVar58._12_2_ = uVar75;
  auVar58._14_2_ = uVar75;
  uVar75 = (undefined2)(uVar42 >> 0x20);
  auVar57._12_4_ = auVar58._12_4_;
  auVar57._8_2_ = 0;
  auVar57._0_8_ = uVar42;
  auVar57._10_2_ = uVar75;
  auVar56._10_6_ = auVar57._10_6_;
  auVar56._8_2_ = uVar75;
  auVar56._0_8_ = uVar42;
  uVar75 = (undefined2)(uVar42 >> 0x10);
  auVar21._4_8_ = auVar56._8_8_;
  auVar21._2_2_ = uVar75;
  auVar21._0_2_ = uVar75;
  auVar115._0_8_ =
       CONCAT44(((float)(auVar21._0_4_ >> 0x10) - fVar220) * fVar114,
                ((float)(int)(short)uVar42 - fVar214) * fVar84);
  auVar115._8_4_ = ((float)(auVar56._8_4_ >> 0x10) - fVar221) * fVar122;
  auVar115._12_4_ = ((float)(auVar57._12_4_ >> 0x10) - fVar222) * fVar149;
  uVar42 = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + 6);
  uVar75 = (undefined2)(uVar42 >> 0x30);
  auVar61._8_4_ = 0;
  auVar61._0_8_ = uVar42;
  auVar61._12_2_ = uVar75;
  auVar61._14_2_ = uVar75;
  uVar75 = (undefined2)(uVar42 >> 0x20);
  auVar60._12_4_ = auVar61._12_4_;
  auVar60._8_2_ = 0;
  auVar60._0_8_ = uVar42;
  auVar60._10_2_ = uVar75;
  auVar59._10_6_ = auVar60._10_6_;
  auVar59._8_2_ = uVar75;
  auVar59._0_8_ = uVar42;
  uVar75 = (undefined2)(uVar42 >> 0x10);
  auVar22._4_8_ = auVar59._8_8_;
  auVar22._2_2_ = uVar75;
  auVar22._0_2_ = uVar75;
  aVar212._0_4_ = ((float)(int)(short)uVar42 - fVar214) * fVar84;
  aVar212._4_4_ = ((float)(auVar22._0_4_ >> 0x10) - fVar220) * fVar114;
  aVar212._8_4_ = ((float)(auVar59._8_4_ >> 0x10) - fVar221) * fVar122;
  aVar212._12_4_ = ((float)(auVar60._12_4_ >> 0x10) - fVar222) * fVar149;
  uVar42 = *(ulong *)(prim + uVar40 * 0x15 + 6);
  uVar75 = (undefined2)(uVar42 >> 0x30);
  auVar64._8_4_ = 0;
  auVar64._0_8_ = uVar42;
  auVar64._12_2_ = uVar75;
  auVar64._14_2_ = uVar75;
  uVar75 = (undefined2)(uVar42 >> 0x20);
  auVar63._12_4_ = auVar64._12_4_;
  auVar63._8_2_ = 0;
  auVar63._0_8_ = uVar42;
  auVar63._10_2_ = uVar75;
  auVar62._10_6_ = auVar63._10_6_;
  auVar62._8_2_ = uVar75;
  auVar62._0_8_ = uVar42;
  uVar75 = (undefined2)(uVar42 >> 0x10);
  auVar23._4_8_ = auVar62._8_8_;
  auVar23._2_2_ = uVar75;
  auVar23._0_2_ = uVar75;
  auVar98._0_8_ =
       CONCAT44(((float)(auVar23._0_4_ >> 0x10) - fVar203) * fVar120,
                ((float)(int)(short)uVar42 - fVar197) * fVar109);
  auVar98._8_4_ = ((float)(auVar62._8_4_ >> 0x10) - fVar205) * fVar131;
  auVar98._12_4_ = ((float)(auVar63._12_4_ >> 0x10) - fVar213) * fVar150;
  uVar42 = *(ulong *)(prim + uVar40 * 0x17 + 6);
  uVar75 = (undefined2)(uVar42 >> 0x30);
  auVar67._8_4_ = 0;
  auVar67._0_8_ = uVar42;
  auVar67._12_2_ = uVar75;
  auVar67._14_2_ = uVar75;
  uVar75 = (undefined2)(uVar42 >> 0x20);
  auVar66._12_4_ = auVar67._12_4_;
  auVar66._8_2_ = 0;
  auVar66._0_8_ = uVar42;
  auVar66._10_2_ = uVar75;
  auVar65._10_6_ = auVar66._10_6_;
  auVar65._8_2_ = uVar75;
  auVar65._0_8_ = uVar42;
  uVar75 = (undefined2)(uVar42 >> 0x10);
  auVar24._4_8_ = auVar65._8_8_;
  auVar24._2_2_ = uVar75;
  auVar24._0_2_ = uVar75;
  auVar68._0_4_ = ((float)(int)(short)uVar42 - fVar197) * fVar109;
  auVar68._4_4_ = ((float)(auVar24._0_4_ >> 0x10) - fVar203) * fVar120;
  auVar68._8_4_ = ((float)(auVar65._8_4_ >> 0x10) - fVar205) * fVar131;
  auVar68._12_4_ = ((float)(auVar66._12_4_ >> 0x10) - fVar213) * fVar150;
  auVar155._8_4_ = auVar139._8_4_;
  auVar155._0_8_ = auVar139._0_8_;
  auVar155._12_4_ = auVar139._12_4_;
  auVar156 = minps(auVar155,auVar186);
  auVar124._8_4_ = auVar115._8_4_;
  auVar124._0_8_ = auVar115._0_8_;
  auVar124._12_4_ = auVar115._12_4_;
  auVar51 = minps(auVar124,(undefined1  [16])aVar212);
  auVar156 = maxps(auVar156,auVar51);
  auVar125._8_4_ = auVar98._8_4_;
  auVar125._0_8_ = auVar98._0_8_;
  auVar125._12_4_ = auVar98._12_4_;
  auVar51 = minps(auVar125,auVar68);
  aVar200.i[1] = uVar43;
  aVar200.i[0] = uVar43;
  aVar200.i[2] = uVar43;
  aVar200.i[3] = uVar43;
  auVar51 = maxps(auVar51,(undefined1  [16])aVar200);
  auVar51 = maxps(auVar156,auVar51);
  local_48 = auVar51._0_4_ * 0.99999964;
  fStack_44 = auVar51._4_4_ * 0.99999964;
  fStack_40 = auVar51._8_4_ * 0.99999964;
  fStack_3c = auVar51._12_4_ * 0.99999964;
  auVar156 = maxps(auVar139,auVar186);
  auVar51 = maxps(auVar115,(undefined1  [16])aVar212);
  auVar156 = minps(auVar156,auVar51);
  auVar51 = maxps(auVar98,auVar68);
  uVar43 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar69._4_4_ = uVar43;
  auVar69._0_4_ = uVar43;
  auVar69._8_4_ = uVar43;
  auVar69._12_4_ = uVar43;
  auVar51 = minps(auVar51,auVar69);
  auVar51 = minps(auVar156,auVar51);
  auVar99._0_4_ = -(uint)(PVar4 != (Primitive)0x0 && local_48 <= auVar51._0_4_ * 1.0000004);
  auVar99._4_4_ = -(uint)(1 < (byte)PVar4 && fStack_44 <= auVar51._4_4_ * 1.0000004);
  auVar99._8_4_ = -(uint)(2 < (byte)PVar4 && fStack_40 <= auVar51._8_4_ * 1.0000004);
  auVar99._12_4_ = -(uint)(3 < (byte)PVar4 && fStack_3c <= auVar51._12_4_ * 1.0000004);
  uVar43 = movmskps((int)unaff_R14,auVar99);
  local_388 = mm_lookupmask_ps._0_8_;
  uStack_380 = mm_lookupmask_ps._8_8_;
  local_318 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  uVar42 = CONCAT44((int)((ulong)unaff_R14 >> 0x20),uVar43);
  local_310 = pre;
  while (uVar42 != 0) {
    lVar37 = 0;
    if (uVar42 != 0) {
      for (; (uVar42 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
      }
    }
    uVar41 = uVar42 - 1 & uVar42;
    uStack_4d0._0_4_ = *(uint *)(prim + 2);
    local_390 = (ulong)(uint)uStack_4d0;
    uVar44 = *(uint *)(prim + lVar37 * 4 + 6);
    pauVar31 = (undefined1 (*) [16])(ulong)uVar44;
    pGVar7 = (context->scene->geometries).items[local_390].ptr;
    pGVar36 = (Geometry *)
              pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    uVar40 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 + (long)pGVar36 * (long)pauVar31);
    p_Var29 = pGVar7[1].intersectionFilterN;
    lVar37 = *(long *)&pGVar7[1].time_range.upper;
    pfVar1 = (float *)(lVar37 + (long)p_Var29 * uVar40);
    local_348 = *pfVar1;
    fStack_344 = pfVar1[1];
    bhit.curve3D.v0.field_0._0_8_ = *(undefined8 *)pfVar1;
    fStack_340 = pfVar1[2];
    fVar133 = pfVar1[3];
    bhit.curve3D.v0.field_0._8_8_ = *(undefined8 *)(pfVar1 + 2);
    pfVar1 = (float *)(lVar37 + (uVar40 + 1) * (long)p_Var29);
    local_358 = *pfVar1;
    fStack_354 = pfVar1[1];
    bhit.curve3D.v1.field_0._0_8_ = *(undefined8 *)pfVar1;
    fStack_350 = pfVar1[2];
    fVar84 = pfVar1[3];
    bhit.curve3D.v1.field_0._8_8_ = *(undefined8 *)(pfVar1 + 2);
    pfVar1 = (float *)(lVar37 + (uVar40 + 2) * (long)p_Var29);
    local_368 = *pfVar1;
    fStack_364 = pfVar1[1];
    bhit.curve3D.v2.field_0._0_8_ = *(undefined8 *)pfVar1;
    fStack_360 = pfVar1[2];
    fVar109 = pfVar1[3];
    bhit.curve3D.v2.field_0._8_8_ = *(undefined8 *)(pfVar1 + 2);
    lVar38 = 0;
    if (uVar41 != 0) {
      for (; (uVar41 >> lVar38 & 1) == 0; lVar38 = lVar38 + 1) {
      }
    }
    pfVar1 = (float *)(lVar37 + (uVar40 + 3) * (long)p_Var29);
    local_378 = *pfVar1;
    fStack_374 = pfVar1[1];
    bhit.curve3D.v3.field_0._0_8_ = *(undefined8 *)pfVar1;
    fStack_370 = pfVar1[2];
    fVar111 = pfVar1[3];
    bhit.curve3D.v3.field_0._8_8_ = *(undefined8 *)(pfVar1 + 2);
    if ((uVar41 != 0) && (uVar40 = uVar41 - 1 & uVar41, uVar40 != 0)) {
      lVar37 = 0;
      if (uVar40 != 0) {
        for (; (uVar40 >> lVar37 & 1) == 0; lVar37 = lVar37 + 1) {
        }
      }
      pGVar36 = (Geometry *)((long)pGVar36 * (ulong)*(uint *)(prim + lVar37 * 4 + 6));
    }
    iVar6 = (int)pGVar7[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    fVar114 = *(float *)(ray + k * 4);
    fVar120 = *(float *)(ray + k * 4 + 0x10);
    fVar121 = *(float *)(ray + k * 4 + 0x20);
    fVar197 = local_348 - fVar114;
    fVar203 = fStack_344 - fVar120;
    fVar205 = fStack_340 - fVar121;
    fVar122 = pre->ray_space[k].vx.field_0.m128[0];
    fVar131 = pre->ray_space[k].vx.field_0.m128[1];
    fVar137 = pre->ray_space[k].vx.field_0.m128[2];
    fVar149 = pre->ray_space[k].vy.field_0.m128[0];
    fVar150 = pre->ray_space[k].vy.field_0.m128[1];
    fVar151 = pre->ray_space[k].vy.field_0.m128[2];
    fVar162 = pre->ray_space[k].vz.field_0.m128[0];
    fVar165 = pre->ray_space[k].vz.field_0.m128[1];
    fVar208 = pre->ray_space[k].vz.field_0.m128[2];
    fVar213 = fVar197 * fVar122 + fVar203 * fVar149 + fVar205 * fVar162;
    fVar170 = fVar197 * fVar131 + fVar203 * fVar150 + fVar205 * fVar165;
    fVar192 = fVar197 * fVar137 + fVar203 * fVar151 + fVar205 * fVar208;
    fVar197 = local_358 - fVar114;
    fVar203 = fStack_354 - fVar120;
    fVar205 = fStack_350 - fVar121;
    local_338 = fVar197 * fVar122 + fVar203 * fVar149 + fVar205 * fVar162;
    fVar189 = fVar197 * fVar131 + fVar203 * fVar150 + fVar205 * fVar165;
    fVar214 = fVar197 * fVar137 + fVar203 * fVar151 + fVar205 * fVar208;
    fVar197 = local_368 - fVar114;
    fVar203 = fStack_364 - fVar120;
    fVar205 = fStack_360 - fVar121;
    fVar215 = fVar197 * fVar122 + fVar203 * fVar149 + fVar205 * fVar162;
    fVar218 = fVar197 * fVar131 + fVar203 * fVar150 + fVar205 * fVar165;
    local_328 = fVar197 * fVar137 + fVar203 * fVar151 + fVar205 * fVar208;
    fVar114 = local_378 - fVar114;
    fVar120 = fStack_374 - fVar120;
    fVar121 = fStack_370 - fVar121;
    fVar122 = fVar114 * fVar122 + fVar120 * fVar149 + fVar121 * fVar162;
    fVar131 = fVar114 * fVar131 + fVar120 * fVar150 + fVar121 * fVar165;
    fVar120 = fVar114 * fVar137 + fVar120 * fVar151 + fVar121 * fVar208;
    auVar270._0_8_ = CONCAT44(fVar170,fVar213) & 0x7fffffff7fffffff;
    auVar270._8_4_ = ABS(fVar192);
    auVar270._12_4_ = ABS(fVar133);
    auVar140._0_8_ = CONCAT44(fVar189,local_338) & 0x7fffffff7fffffff;
    auVar140._8_4_ = ABS(fVar214);
    auVar140._12_4_ = ABS(fVar84);
    auVar156 = maxps(auVar270,auVar140);
    auVar157._0_8_ = CONCAT44(fVar218,fVar215) & 0x7fffffff7fffffff;
    auVar157._8_4_ = ABS(local_328);
    auVar157._12_4_ = ABS(fVar109);
    auVar100._0_8_ = CONCAT44(fVar131,fVar122) & 0x7fffffff7fffffff;
    auVar100._8_4_ = ABS(fVar120);
    auVar100._12_4_ = ABS(fVar111);
    auVar51 = maxps(auVar157,auVar100);
    auVar51 = maxps(auVar156,auVar51);
    uVar80 = auVar51._8_8_;
    fVar114 = auVar51._4_4_;
    if (auVar51._4_4_ <= auVar51._0_4_) {
      fVar114 = auVar51._0_4_;
    }
    fVar121 = (float)iVar6;
    auVar271._8_8_ = uVar80;
    auVar271._0_8_ = uVar80;
    if (auVar51._8_4_ <= fVar114) {
      auVar272._4_12_ = auVar271._4_12_;
      auVar272._0_4_ = fVar114;
      uVar80 = auVar272._0_8_;
    }
    lVar37 = (long)iVar6 * 0x44;
    fVar114 = *(float *)*(undefined1 (*) [12])(catmullrom_basis0 + lVar37 + 0x908);
    fVar137 = *(float *)(catmullrom_basis0 + lVar37 + 0x90c);
    fVar149 = *(float *)(catmullrom_basis0 + lVar37 + 0x910);
    auVar10 = *(undefined1 (*) [12])(catmullrom_basis0 + lVar37 + 0x908);
    fVar150 = *(float *)(catmullrom_basis0 + lVar37 + 0x914);
    fVar151 = *(float *)(catmullrom_basis0 + lVar37 + 0xd8c);
    fVar162 = *(float *)(catmullrom_basis0 + lVar37 + 0xd90);
    fVar165 = *(float *)(catmullrom_basis0 + lVar37 + 0xd94);
    fVar208 = *(float *)(catmullrom_basis0 + lVar37 + 0xd98);
    fVar197 = *(float *)(catmullrom_basis0 + lVar37 + 0x484);
    fVar203 = *(float *)(catmullrom_basis0 + lVar37 + 0x488);
    fVar205 = *(float *)(catmullrom_basis0 + lVar37 + 0x48c);
    fVar219 = *(float *)(catmullrom_basis0 + lVar37 + 0x490);
    fVar220 = *(float *)*(undefined1 (*) [12])(catmullrom_basis0 + lVar37);
    fVar221 = *(float *)(catmullrom_basis0 + lVar37 + 4);
    fVar222 = *(float *)(catmullrom_basis0 + lVar37 + 8);
    auVar11 = *(undefined1 (*) [12])(catmullrom_basis0 + lVar37);
    fVar234 = *(float *)(catmullrom_basis0 + lVar37 + 0xc);
    fVar235 = fVar213 * fVar220 + local_338 * fVar197 + fVar215 * fVar114 + fVar122 * fVar151;
    fVar245 = fVar213 * fVar221 + local_338 * fVar203 + fVar215 * fVar137 + fVar122 * fVar162;
    fVar248 = fVar213 * fVar222 + local_338 * fVar205 + fVar215 * fVar149 + fVar122 * fVar165;
    fVar252 = fVar213 * fVar234 + local_338 * fVar219 + fVar215 * fVar150 + fVar122 * fVar208;
    fVar123 = fVar170 * fVar220 + fVar189 * fVar197 + fVar218 * fVar114 + fVar131 * fVar151;
    fVar132 = fVar170 * fVar221 + fVar189 * fVar203 + fVar218 * fVar137 + fVar131 * fVar162;
    fVar134 = fVar170 * fVar222 + fVar189 * fVar205 + fVar218 * fVar149 + fVar131 * fVar165;
    fVar135 = fVar170 * fVar234 + fVar189 * fVar219 + fVar218 * fVar150 + fVar131 * fVar208;
    fVar152 = fVar133 * fVar220 + fVar84 * fVar197 + fVar109 * fVar114 + fVar111 * fVar151;
    fVar163 = fVar133 * fVar221 + fVar84 * fVar203 + fVar109 * fVar137 + fVar111 * fVar162;
    auVar209._4_4_ = fVar163;
    auVar209._0_4_ = fVar152;
    fVar166 = fVar133 * fVar222 + fVar84 * fVar205 + fVar109 * fVar149 + fVar111 * fVar165;
    fVar168 = fVar133 * fVar234 + fVar84 * fVar219 + fVar109 * fVar150 + fVar111 * fVar208;
    fVar137 = *(float *)(catmullrom_basis1 + lVar37 + 0xd8c);
    fVar149 = *(float *)(catmullrom_basis1 + lVar37 + 0xd90);
    fVar220 = *(float *)(catmullrom_basis1 + lVar37 + 0xd94);
    fVar221 = *(float *)(catmullrom_basis1 + lVar37 + 0xd98);
    fVar114 = *(float *)*(undefined1 (*) [12])(catmullrom_basis1 + lVar37 + 0x908);
    fVar222 = *(float *)(catmullrom_basis1 + lVar37 + 0x90c);
    fVar244 = *(float *)(catmullrom_basis1 + lVar37 + 0x910);
    auVar12 = *(undefined1 (*) [12])(catmullrom_basis1 + lVar37 + 0x908);
    fVar247 = *(float *)(catmullrom_basis1 + lVar37 + 0x914);
    fVar251 = *(float *)(catmullrom_basis1 + lVar37 + 0x484);
    fVar255 = *(float *)(catmullrom_basis1 + lVar37 + 0x488);
    fVar263 = *(float *)(catmullrom_basis1 + lVar37 + 0x48c);
    fVar265 = *(float *)(catmullrom_basis1 + lVar37 + 0x490);
    fVar267 = *(float *)(catmullrom_basis1 + lVar37);
    fVar249 = *(float *)(catmullrom_basis1 + lVar37 + 4);
    fVar253 = *(float *)(catmullrom_basis1 + lVar37 + 8);
    fVar199 = *(float *)(catmullrom_basis1 + lVar37 + 0xc);
    fVar171 = fVar213 * fVar267 + local_338 * fVar251 + fVar215 * fVar114 + fVar122 * fVar137;
    fVar190 = fVar213 * fVar249 + local_338 * fVar255 + fVar215 * fVar222 + fVar122 * fVar149;
    fVar193 = fVar213 * fVar253 + local_338 * fVar263 + fVar215 * fVar244 + fVar122 * fVar220;
    fVar195 = fVar213 * fVar199 + local_338 * fVar265 + fVar215 * fVar247 + fVar122 * fVar221;
    fVar256 = fVar170 * fVar267 + fVar189 * fVar251 + fVar218 * fVar114 + fVar131 * fVar137;
    fVar264 = fVar170 * fVar249 + fVar189 * fVar255 + fVar218 * fVar222 + fVar131 * fVar149;
    fVar266 = fVar170 * fVar253 + fVar189 * fVar263 + fVar218 * fVar244 + fVar131 * fVar220;
    fVar268 = fVar170 * fVar199 + fVar189 * fVar265 + fVar218 * fVar247 + fVar131 * fVar221;
    auVar116._0_4_ = fVar133 * fVar267 + fVar84 * fVar251 + fVar109 * fVar114 + fVar111 * fVar137;
    auVar116._4_4_ = fVar133 * fVar249 + fVar84 * fVar255 + fVar109 * fVar222 + fVar111 * fVar149;
    auVar116._8_4_ = fVar133 * fVar253 + fVar84 * fVar263 + fVar109 * fVar244 + fVar111 * fVar220;
    auVar116._12_4_ = fVar133 * fVar199 + fVar84 * fVar265 + fVar109 * fVar247 + fVar111 * fVar221;
    fVar172 = fVar171 - fVar235;
    fVar191 = fVar190 - fVar245;
    fVar194 = fVar193 - fVar248;
    fVar196 = fVar195 - fVar252;
    fVar153 = fVar256 - fVar123;
    fVar164 = fVar264 - fVar132;
    fVar167 = fVar266 - fVar134;
    fVar169 = fVar268 - fVar135;
    fVar114 = fVar123 * fVar172 - fVar235 * fVar153;
    fVar222 = fVar132 * fVar191 - fVar245 * fVar164;
    fVar244 = fVar134 * fVar194 - fVar248 * fVar167;
    fVar136 = fVar135 * fVar196 - fVar252 * fVar169;
    auVar209._8_4_ = fVar166;
    auVar209._12_4_ = fVar168;
    auVar51 = maxps(auVar209,auVar116);
    bVar27 = fVar114 * fVar114 <=
             auVar51._0_4_ * auVar51._0_4_ * (fVar172 * fVar172 + fVar153 * fVar153) &&
             0.0 < fVar121;
    auVar126._0_4_ = -(uint)bVar27;
    bVar28 = fVar222 * fVar222 <=
             auVar51._4_4_ * auVar51._4_4_ * (fVar191 * fVar191 + fVar164 * fVar164) &&
             1.0 < fVar121;
    auVar126._4_4_ = -(uint)bVar28;
    bVar26 = fVar244 * fVar244 <=
             auVar51._8_4_ * auVar51._8_4_ * (fVar194 * fVar194 + fVar167 * fVar167) &&
             2.0 < fVar121;
    auVar126._8_4_ = -(uint)bVar26;
    bVar25 = fVar136 * fVar136 <=
             auVar51._12_4_ * auVar51._12_4_ * (fVar196 * fVar196 + fVar169 * fVar169) &&
             3.0 < fVar121;
    auVar126._12_4_ = -(uint)bVar25;
    local_3e8 = (float)uVar80;
    local_3e8 = local_3e8 * 4.7683716e-07;
    iVar33 = movmskps((int)(pre->ray_space + k),auVar126);
    fVar114 = *(float *)(ray + k * 4 + 0x30);
    fStack_36c = fVar111;
    fStack_35c = fVar109;
    fStack_34c = fVar84;
    fStack_33c = fVar133;
    fStack_334 = local_338;
    fStack_330 = local_338;
    fStack_32c = local_338;
    fStack_324 = local_328;
    fStack_320 = local_328;
    fStack_31c = local_328;
    if (iVar33 == 0) {
      uVar40 = 0;
    }
    else {
      local_438 = auVar12._0_4_;
      fStack_434 = auVar12._4_4_;
      fStack_430 = auVar12._8_4_;
      fVar50 = fVar137 * fVar120 + local_438 * local_328 + fVar251 * fVar214 + fVar267 * fVar192;
      fVar77 = fVar149 * fVar120 + fStack_434 * local_328 + fVar255 * fVar214 + fVar249 * fVar192;
      fVar79 = fVar220 * fVar120 + fStack_430 * local_328 + fVar263 * fVar214 + fVar253 * fVar192;
      fVar82 = fVar221 * fVar120 + fVar247 * local_328 + fVar265 * fVar214 + fVar199 * fVar192;
      local_3d8 = auVar11._0_4_;
      fStack_3d4 = auVar11._4_4_;
      fStack_3d0 = auVar11._8_4_;
      local_3f8._0_4_ = auVar10._0_4_;
      local_3f8._4_4_ = auVar10._4_4_;
      uStack_3f0._0_4_ = auVar10._8_4_;
      fVar85 = fVar151 * fVar120 + (float)local_3f8 * local_328 + fVar197 * fVar214 +
               local_3d8 * fVar192;
      fVar110 = fVar162 * fVar120 + local_3f8._4_4_ * local_328 + fVar203 * fVar214 +
                fStack_3d4 * fVar192;
      fVar112 = fVar165 * fVar120 + (float)uStack_3f0 * local_328 + fVar205 * fVar214 +
                fStack_3d0 * fVar192;
      fVar113 = fVar208 * fVar120 + fVar150 * local_328 + fVar219 * fVar214 + fVar234 * fVar192;
      fVar137 = *(float *)(catmullrom_basis0 + lVar37 + 0x1210);
      fVar149 = *(float *)(catmullrom_basis0 + lVar37 + 0x1214);
      fVar150 = *(float *)(catmullrom_basis0 + lVar37 + 0x1218);
      fVar151 = *(float *)(catmullrom_basis0 + lVar37 + 0x121c);
      fVar162 = *(float *)(catmullrom_basis0 + lVar37 + 0x1694);
      fVar165 = *(float *)(catmullrom_basis0 + lVar37 + 0x1698);
      fVar208 = *(float *)(catmullrom_basis0 + lVar37 + 0x169c);
      fVar197 = *(float *)(catmullrom_basis0 + lVar37 + 0x16a0);
      fVar203 = *(float *)(catmullrom_basis0 + lVar37 + 0x1b18);
      fVar205 = *(float *)(catmullrom_basis0 + lVar37 + 0x1b1c);
      fVar219 = *(float *)(catmullrom_basis0 + lVar37 + 0x1b20);
      fVar220 = *(float *)(catmullrom_basis0 + lVar37 + 0x1b24);
      fVar221 = *(float *)(catmullrom_basis0 + lVar37 + 0x1f9c);
      fVar222 = *(float *)(catmullrom_basis0 + lVar37 + 0x1fa0);
      fVar234 = *(float *)(catmullrom_basis0 + lVar37 + 0x1fa4);
      fVar244 = *(float *)(catmullrom_basis0 + lVar37 + 0x1fa8);
      fVar224 = fVar213 * fVar137 + local_338 * fVar162 + fVar215 * fVar203 + fVar122 * fVar221;
      fVar227 = fVar213 * fVar149 + local_338 * fVar165 + fVar215 * fVar205 + fVar122 * fVar222;
      fVar229 = fVar213 * fVar150 + local_338 * fVar208 + fVar215 * fVar219 + fVar122 * fVar234;
      fVar232 = fVar213 * fVar151 + local_338 * fVar197 + fVar215 * fVar220 + fVar122 * fVar244;
      fVar278 = fVar170 * fVar137 + fVar189 * fVar162 + fVar218 * fVar203 + fVar131 * fVar221;
      fVar279 = fVar170 * fVar149 + fVar189 * fVar165 + fVar218 * fVar205 + fVar131 * fVar222;
      fVar280 = fVar170 * fVar150 + fVar189 * fVar208 + fVar218 * fVar219 + fVar131 * fVar234;
      fVar281 = fVar170 * fVar151 + fVar189 * fVar197 + fVar218 * fVar220 + fVar131 * fVar244;
      fVar247 = *(float *)(catmullrom_basis1 + lVar37 + 0x1210);
      fVar251 = *(float *)(catmullrom_basis1 + lVar37 + 0x1214);
      fVar255 = *(float *)(catmullrom_basis1 + lVar37 + 0x1218);
      fVar263 = *(float *)(catmullrom_basis1 + lVar37 + 0x121c);
      fVar265 = *(float *)(catmullrom_basis1 + lVar37 + 0x1b18);
      fVar267 = *(float *)(catmullrom_basis1 + lVar37 + 0x1b1c);
      fVar249 = *(float *)(catmullrom_basis1 + lVar37 + 0x1b20);
      fVar253 = *(float *)(catmullrom_basis1 + lVar37 + 0x1b24);
      fVar199 = *(float *)(catmullrom_basis1 + lVar37 + 0x1f9c);
      fVar136 = *(float *)(catmullrom_basis1 + lVar37 + 0x1fa0);
      fVar230 = *(float *)(catmullrom_basis1 + lVar37 + 0x1fa4);
      fVar233 = *(float *)(catmullrom_basis1 + lVar37 + 0x1fa8);
      auVar141._0_4_ = fVar218 * fVar265 + fVar131 * fVar199;
      auVar141._4_4_ = fVar218 * fVar267 + fVar131 * fVar136;
      auVar141._8_4_ = fVar218 * fVar249 + fVar131 * fVar230;
      auVar141._12_4_ = fVar218 * fVar253 + fVar131 * fVar233;
      fVar236 = *(float *)(catmullrom_basis1 + lVar37 + 0x1694);
      fVar246 = *(float *)(catmullrom_basis1 + lVar37 + 0x1698);
      fVar250 = *(float *)(catmullrom_basis1 + lVar37 + 0x169c);
      fVar254 = *(float *)(catmullrom_basis1 + lVar37 + 0x16a0);
      fVar269 = fVar213 * fVar247 + local_338 * fVar236 + fVar215 * fVar265 + fVar122 * fVar199;
      fVar275 = fVar213 * fVar251 + local_338 * fVar246 + fVar215 * fVar267 + fVar122 * fVar136;
      fVar276 = fVar213 * fVar255 + local_338 * fVar250 + fVar215 * fVar249 + fVar122 * fVar230;
      fVar277 = fVar213 * fVar263 + local_338 * fVar254 + fVar215 * fVar253 + fVar122 * fVar233;
      fVar198 = fVar170 * fVar247 + fVar189 * fVar236 + auVar141._0_4_;
      fVar204 = fVar170 * fVar251 + fVar189 * fVar246 + auVar141._4_4_;
      fVar206 = fVar170 * fVar255 + fVar189 * fVar250 + auVar141._8_4_;
      fVar207 = fVar170 * fVar263 + fVar189 * fVar254 + auVar141._12_4_;
      auVar241._0_8_ = CONCAT44(fVar227,fVar224) & 0x7fffffff7fffffff;
      auVar241._8_4_ = ABS(fVar229);
      auVar241._12_4_ = ABS(fVar232);
      auVar210._0_8_ = CONCAT44(fVar279,fVar278) & 0x7fffffff7fffffff;
      auVar210._8_4_ = ABS(fVar280);
      auVar210._12_4_ = ABS(fVar281);
      auVar51 = maxps(auVar241,auVar210);
      auVar258._0_8_ =
           CONCAT44(fVar149 * fVar192 + fVar165 * fVar214 + fVar205 * local_328 + fVar222 * fVar120,
                    fVar137 * fVar192 + fVar162 * fVar214 + fVar203 * local_328 + fVar221 * fVar120)
           & 0x7fffffff7fffffff;
      auVar258._8_4_ =
           ABS(fVar150 * fVar192 + fVar208 * fVar214 + fVar219 * local_328 + fVar234 * fVar120);
      auVar258._12_4_ =
           ABS(fVar151 * fVar192 + fVar197 * fVar214 + fVar220 * local_328 + fVar244 * fVar120);
      auVar51 = maxps(auVar51,auVar258);
      uVar45 = -(uint)(local_3e8 <= auVar51._0_4_);
      uVar46 = -(uint)(local_3e8 <= auVar51._4_4_);
      uVar47 = -(uint)(local_3e8 <= auVar51._8_4_);
      uVar48 = -(uint)(local_3e8 <= auVar51._12_4_);
      fVar165 = (float)((uint)fVar224 & uVar45 | ~uVar45 & (uint)fVar172);
      fVar197 = (float)((uint)fVar227 & uVar46 | ~uVar46 & (uint)fVar191);
      fVar203 = (float)((uint)fVar229 & uVar47 | ~uVar47 & (uint)fVar194);
      fVar205 = (float)((uint)fVar232 & uVar48 | ~uVar48 & (uint)fVar196);
      fVar219 = (float)(~uVar45 & (uint)fVar153 | (uint)fVar278 & uVar45);
      fVar220 = (float)(~uVar46 & (uint)fVar164 | (uint)fVar279 & uVar46);
      fVar221 = (float)(~uVar47 & (uint)fVar167 | (uint)fVar280 & uVar47);
      fVar222 = (float)(~uVar48 & (uint)fVar169 | (uint)fVar281 & uVar48);
      auVar259._0_8_ = CONCAT44(fVar275,fVar269) & 0x7fffffff7fffffff;
      auVar259._8_4_ = ABS(fVar276);
      auVar259._12_4_ = ABS(fVar277);
      auVar217._0_8_ = CONCAT44(fVar204,fVar198) & 0x7fffffff7fffffff;
      auVar217._8_4_ = ABS(fVar206);
      auVar217._12_4_ = ABS(fVar207);
      auVar51 = maxps(auVar259,auVar217);
      auVar187._0_8_ =
           CONCAT44(fVar251 * fVar192 + fVar246 * fVar214 + fVar267 * local_328 + fVar136 * fVar120,
                    fVar247 * fVar192 + fVar236 * fVar214 + fVar265 * local_328 + fVar199 * fVar120)
           & 0x7fffffff7fffffff;
      auVar187._8_4_ =
           ABS(fVar255 * fVar192 + fVar250 * fVar214 + fVar249 * local_328 + fVar230 * fVar120);
      auVar187._12_4_ =
           ABS(fVar263 * fVar192 + fVar254 * fVar214 + fVar253 * local_328 + fVar233 * fVar120);
      auVar51 = maxps(auVar51,auVar187);
      uVar45 = -(uint)(local_3e8 <= auVar51._0_4_);
      uVar46 = -(uint)(local_3e8 <= auVar51._4_4_);
      uVar47 = -(uint)(local_3e8 <= auVar51._8_4_);
      uVar48 = -(uint)(local_3e8 <= auVar51._12_4_);
      fVar263 = (float)((uint)fVar269 & uVar45 | ~uVar45 & (uint)fVar172);
      fVar267 = (float)((uint)fVar275 & uVar46 | ~uVar46 & (uint)fVar191);
      fVar199 = (float)((uint)fVar276 & uVar47 | ~uVar47 & (uint)fVar194);
      fVar136 = (float)((uint)fVar277 & uVar48 | ~uVar48 & (uint)fVar196);
      fVar234 = (float)(~uVar45 & (uint)fVar153 | (uint)fVar198 & uVar45);
      fVar244 = (float)(~uVar46 & (uint)fVar164 | (uint)fVar204 & uVar46);
      fVar247 = (float)(~uVar47 & (uint)fVar167 | (uint)fVar206 & uVar47);
      fVar251 = (float)(~uVar48 & (uint)fVar169 | (uint)fVar207 & uVar48);
      auVar101._0_4_ = fVar219 * fVar219 + fVar165 * fVar165;
      auVar101._4_4_ = fVar220 * fVar220 + fVar197 * fVar197;
      auVar101._8_4_ = fVar221 * fVar221 + fVar203 * fVar203;
      auVar101._12_4_ = fVar222 * fVar222 + fVar205 * fVar205;
      auVar51 = rsqrtps(auVar141,auVar101);
      fVar137 = auVar51._0_4_;
      fVar149 = auVar51._4_4_;
      fVar150 = auVar51._8_4_;
      fVar151 = auVar51._12_4_;
      auVar142._0_4_ = fVar137 * fVar137 * auVar101._0_4_ * 0.5 * fVar137;
      auVar142._4_4_ = fVar149 * fVar149 * auVar101._4_4_ * 0.5 * fVar149;
      auVar142._8_4_ = fVar150 * fVar150 * auVar101._8_4_ * 0.5 * fVar150;
      auVar142._12_4_ = fVar151 * fVar151 * auVar101._12_4_ * 0.5 * fVar151;
      fVar153 = fVar137 * 1.5 - auVar142._0_4_;
      fVar164 = fVar149 * 1.5 - auVar142._4_4_;
      fVar167 = fVar150 * 1.5 - auVar142._8_4_;
      fVar169 = fVar151 * 1.5 - auVar142._12_4_;
      auVar102._0_4_ = fVar234 * fVar234 + fVar263 * fVar263;
      auVar102._4_4_ = fVar244 * fVar244 + fVar267 * fVar267;
      auVar102._8_4_ = fVar247 * fVar247 + fVar199 * fVar199;
      auVar102._12_4_ = fVar251 * fVar251 + fVar136 * fVar136;
      auVar51 = rsqrtps(auVar142,auVar102);
      fVar137 = auVar51._0_4_;
      fVar149 = auVar51._4_4_;
      fVar150 = auVar51._8_4_;
      fVar151 = auVar51._12_4_;
      fVar137 = fVar137 * 1.5 - fVar137 * fVar137 * auVar102._0_4_ * 0.5 * fVar137;
      fVar162 = fVar149 * 1.5 - fVar149 * fVar149 * auVar102._4_4_ * 0.5 * fVar149;
      fVar150 = fVar150 * 1.5 - fVar150 * fVar150 * auVar102._8_4_ * 0.5 * fVar150;
      fVar208 = fVar151 * 1.5 - fVar151 * fVar151 * auVar102._12_4_ * 0.5 * fVar151;
      fVar255 = fVar219 * fVar153 * fVar152;
      fVar265 = fVar220 * fVar164 * fVar163;
      fVar249 = fVar221 * fVar167 * fVar166;
      fVar253 = fVar222 * fVar169 * fVar168;
      fVar149 = -fVar165 * fVar153 * fVar152;
      fVar151 = -fVar197 * fVar164 * fVar163;
      fVar165 = -fVar203 * fVar167 * fVar166;
      fVar197 = -fVar205 * fVar169 * fVar168;
      fVar224 = fVar153 * 0.0 * fVar152;
      fVar227 = fVar164 * 0.0 * fVar163;
      fVar229 = fVar167 * 0.0 * fVar166;
      fVar232 = fVar169 * 0.0 * fVar168;
      fVar198 = fVar234 * fVar137 * auVar116._0_4_;
      fVar204 = fVar244 * fVar162 * auVar116._4_4_;
      fVar206 = fVar247 * fVar150 * auVar116._8_4_;
      fVar207 = fVar251 * fVar208 * auVar116._12_4_;
      fVar167 = fVar171 + fVar198;
      fVar169 = fVar190 + fVar204;
      fVar172 = fVar193 + fVar206;
      fVar191 = fVar195 + fVar207;
      fVar247 = -fVar263 * fVar137 * auVar116._0_4_;
      fVar251 = -fVar267 * fVar162 * auVar116._4_4_;
      fVar263 = -fVar199 * fVar150 * auVar116._8_4_;
      fVar267 = -fVar136 * fVar208 * auVar116._12_4_;
      fVar194 = fVar256 + fVar247;
      fVar196 = fVar264 + fVar251;
      fVar230 = fVar266 + fVar263;
      fVar233 = fVar268 + fVar267;
      fVar203 = fVar137 * 0.0 * auVar116._0_4_;
      fVar205 = fVar162 * 0.0 * auVar116._4_4_;
      fVar219 = fVar150 * 0.0 * auVar116._8_4_;
      fVar220 = fVar208 * 0.0 * auVar116._12_4_;
      fVar199 = fVar235 - fVar255;
      fVar136 = fVar245 - fVar265;
      fVar153 = fVar248 - fVar249;
      fVar164 = fVar252 - fVar253;
      fVar236 = fVar50 + fVar203;
      fVar246 = fVar77 + fVar205;
      fVar250 = fVar79 + fVar219;
      fVar254 = fVar82 + fVar220;
      fVar137 = fVar123 - fVar149;
      fVar150 = fVar132 - fVar151;
      fVar162 = fVar134 - fVar165;
      fVar208 = fVar135 - fVar197;
      fVar221 = fVar85 - fVar224;
      fVar222 = fVar110 - fVar227;
      fVar234 = fVar112 - fVar229;
      fVar244 = fVar113 - fVar232;
      uVar45 = -(uint)(0.0 < (fVar137 * (fVar236 - fVar221) - fVar221 * (fVar194 - fVar137)) * 0.0 +
                             (fVar221 * (fVar167 - fVar199) - (fVar236 - fVar221) * fVar199) * 0.0 +
                             ((fVar194 - fVar137) * fVar199 - (fVar167 - fVar199) * fVar137));
      uVar46 = -(uint)(0.0 < (fVar150 * (fVar246 - fVar222) - fVar222 * (fVar196 - fVar150)) * 0.0 +
                             (fVar222 * (fVar169 - fVar136) - (fVar246 - fVar222) * fVar136) * 0.0 +
                             ((fVar196 - fVar150) * fVar136 - (fVar169 - fVar136) * fVar150));
      uVar47 = -(uint)(0.0 < (fVar162 * (fVar250 - fVar234) - fVar234 * (fVar230 - fVar162)) * 0.0 +
                             (fVar234 * (fVar172 - fVar153) - (fVar250 - fVar234) * fVar153) * 0.0 +
                             ((fVar230 - fVar162) * fVar153 - (fVar172 - fVar153) * fVar162));
      uVar48 = -(uint)(0.0 < (fVar208 * (fVar254 - fVar244) - fVar244 * (fVar233 - fVar208)) * 0.0 +
                             (fVar244 * (fVar191 - fVar164) - (fVar254 - fVar244) * fVar164) * 0.0 +
                             ((fVar233 - fVar208) * fVar164 - (fVar191 - fVar164) * fVar208));
      fVar198 = (float)((uint)(fVar171 - fVar198) & uVar45 | ~uVar45 & (uint)(fVar235 + fVar255));
      fVar204 = (float)((uint)(fVar190 - fVar204) & uVar46 | ~uVar46 & (uint)(fVar245 + fVar265));
      fVar248 = (float)((uint)(fVar193 - fVar206) & uVar47 | ~uVar47 & (uint)(fVar248 + fVar249));
      fVar252 = (float)((uint)(fVar195 - fVar207) & uVar48 | ~uVar48 & (uint)(fVar252 + fVar253));
      fVar247 = (float)((uint)(fVar256 - fVar247) & uVar45 | ~uVar45 & (uint)(fVar123 + fVar149));
      fVar255 = (float)((uint)(fVar264 - fVar251) & uVar46 | ~uVar46 & (uint)(fVar132 + fVar151));
      fVar265 = (float)((uint)(fVar266 - fVar263) & uVar47 | ~uVar47 & (uint)(fVar134 + fVar165));
      fVar249 = (float)((uint)(fVar268 - fVar267) & uVar48 | ~uVar48 & (uint)(fVar135 + fVar197));
      fVar203 = (float)((uint)(fVar50 - fVar203) & uVar45 | ~uVar45 & (uint)(fVar85 + fVar224));
      fVar205 = (float)((uint)(fVar77 - fVar205) & uVar46 | ~uVar46 & (uint)(fVar110 + fVar227));
      fVar219 = (float)((uint)(fVar79 - fVar219) & uVar47 | ~uVar47 & (uint)(fVar112 + fVar229));
      fVar220 = (float)((uint)(fVar82 - fVar220) & uVar48 | ~uVar48 & (uint)(fVar113 + fVar232));
      fVar123 = (float)((uint)fVar199 & uVar45 | ~uVar45 & (uint)fVar167);
      fVar132 = (float)((uint)fVar136 & uVar46 | ~uVar46 & (uint)fVar169);
      fVar134 = (float)((uint)fVar153 & uVar47 | ~uVar47 & (uint)fVar172);
      fVar135 = (float)((uint)fVar164 & uVar48 | ~uVar48 & (uint)fVar191);
      fVar149 = (float)((uint)fVar137 & uVar45 | ~uVar45 & (uint)fVar194);
      fVar151 = (float)((uint)fVar150 & uVar46 | ~uVar46 & (uint)fVar196);
      fVar165 = (float)((uint)fVar162 & uVar47 | ~uVar47 & (uint)fVar230);
      fVar197 = (float)((uint)fVar208 & uVar48 | ~uVar48 & (uint)fVar233);
      fVar251 = (float)((uint)fVar221 & uVar45 | ~uVar45 & (uint)fVar236);
      fVar263 = (float)((uint)fVar222 & uVar46 | ~uVar46 & (uint)fVar246);
      fVar267 = (float)((uint)fVar234 & uVar47 | ~uVar47 & (uint)fVar250);
      fVar253 = (float)((uint)fVar244 & uVar48 | ~uVar48 & (uint)fVar254);
      fVar199 = (float)((uint)fVar167 & uVar45 | ~uVar45 & (uint)fVar199) - fVar198;
      fVar136 = (float)((uint)fVar169 & uVar46 | ~uVar46 & (uint)fVar136) - fVar204;
      fVar153 = (float)((uint)fVar172 & uVar47 | ~uVar47 & (uint)fVar153) - fVar248;
      fVar164 = (float)((uint)fVar191 & uVar48 | ~uVar48 & (uint)fVar164) - fVar252;
      fVar167 = (float)((uint)fVar194 & uVar45 | ~uVar45 & (uint)fVar137) - fVar247;
      fVar169 = (float)((uint)fVar196 & uVar46 | ~uVar46 & (uint)fVar150) - fVar255;
      fVar171 = (float)((uint)fVar230 & uVar47 | ~uVar47 & (uint)fVar162) - fVar265;
      fVar172 = (float)((uint)fVar233 & uVar48 | ~uVar48 & (uint)fVar208) - fVar249;
      fVar190 = (float)((uint)fVar236 & uVar45 | ~uVar45 & (uint)fVar221) - fVar203;
      fVar191 = (float)((uint)fVar246 & uVar46 | ~uVar46 & (uint)fVar222) - fVar205;
      fVar193 = (float)((uint)fVar250 & uVar47 | ~uVar47 & (uint)fVar234) - fVar219;
      fVar194 = (float)((uint)fVar254 & uVar48 | ~uVar48 & (uint)fVar244) - fVar220;
      fVar256 = fVar198 - fVar123;
      fVar264 = fVar204 - fVar132;
      fVar266 = fVar248 - fVar134;
      fVar268 = fVar252 - fVar135;
      fVar221 = fVar247 - fVar149;
      fVar222 = fVar255 - fVar151;
      fVar234 = fVar265 - fVar165;
      fVar244 = fVar249 - fVar197;
      fVar137 = fVar203 - fVar251;
      fVar150 = fVar205 - fVar263;
      fVar162 = fVar219 - fVar267;
      fVar208 = fVar220 - fVar253;
      fVar195 = (fVar247 * fVar190 - fVar203 * fVar167) * 0.0 +
                (fVar203 * fVar199 - fVar198 * fVar190) * 0.0 +
                (fVar198 * fVar167 - fVar247 * fVar199);
      fVar196 = (fVar255 * fVar191 - fVar205 * fVar169) * 0.0 +
                (fVar205 * fVar136 - fVar204 * fVar191) * 0.0 +
                (fVar204 * fVar169 - fVar255 * fVar136);
      auVar127._4_4_ = fVar196;
      auVar127._0_4_ = fVar195;
      fVar235 = (fVar265 * fVar193 - fVar219 * fVar171) * 0.0 +
                (fVar219 * fVar153 - fVar248 * fVar193) * 0.0 +
                (fVar248 * fVar171 - fVar265 * fVar153);
      fVar245 = (fVar249 * fVar194 - fVar220 * fVar172) * 0.0 +
                (fVar220 * fVar164 - fVar252 * fVar194) * 0.0 +
                (fVar252 * fVar172 - fVar249 * fVar164);
      auVar273._0_4_ =
           (fVar149 * fVar137 - fVar251 * fVar221) * 0.0 +
           (fVar251 * fVar256 - fVar123 * fVar137) * 0.0 + (fVar123 * fVar221 - fVar149 * fVar256);
      auVar273._4_4_ =
           (fVar151 * fVar150 - fVar263 * fVar222) * 0.0 +
           (fVar263 * fVar264 - fVar132 * fVar150) * 0.0 + (fVar132 * fVar222 - fVar151 * fVar264);
      auVar273._8_4_ =
           (fVar165 * fVar162 - fVar267 * fVar234) * 0.0 +
           (fVar267 * fVar266 - fVar134 * fVar162) * 0.0 + (fVar134 * fVar234 - fVar165 * fVar266);
      auVar273._12_4_ =
           (fVar197 * fVar208 - fVar253 * fVar244) * 0.0 +
           (fVar253 * fVar268 - fVar135 * fVar208) * 0.0 + (fVar135 * fVar244 - fVar197 * fVar268);
      auVar127._8_4_ = fVar235;
      auVar127._12_4_ = fVar245;
      auVar51 = maxps(auVar127,auVar273);
      bVar27 = auVar51._0_4_ <= 0.0 && bVar27;
      auVar128._0_4_ = -(uint)bVar27;
      bVar28 = auVar51._4_4_ <= 0.0 && bVar28;
      auVar128._4_4_ = -(uint)bVar28;
      bVar26 = auVar51._8_4_ <= 0.0 && bVar26;
      auVar128._8_4_ = -(uint)bVar26;
      bVar25 = auVar51._12_4_ <= 0.0 && bVar25;
      auVar128._12_4_ = -(uint)bVar25;
      iVar33 = movmskps(uVar44,auVar128);
      if (iVar33 == 0) {
LAB_0030927e:
        auVar70._8_8_ = uStack_380;
        auVar70._0_8_ = local_388;
      }
      else {
        fVar251 = fVar221 * fVar190 - fVar137 * fVar167;
        fVar263 = fVar222 * fVar191 - fVar150 * fVar169;
        fVar267 = fVar234 * fVar193 - fVar162 * fVar171;
        fVar253 = fVar244 * fVar194 - fVar208 * fVar172;
        auVar8._4_4_ = fVar136;
        auVar8._0_4_ = fVar199;
        auVar8._8_4_ = fVar153;
        auVar8._12_4_ = fVar164;
        fVar137 = fVar137 * fVar199 - fVar190 * fVar256;
        fVar150 = fVar150 * fVar136 - fVar191 * fVar264;
        fVar162 = fVar162 * fVar153 - fVar193 * fVar266;
        fVar208 = fVar208 * fVar164 - fVar194 * fVar268;
        fVar221 = fVar256 * fVar167 - fVar221 * fVar199;
        fVar222 = fVar264 * fVar169 - fVar222 * fVar136;
        fVar234 = fVar266 * fVar171 - fVar234 * fVar153;
        fVar244 = fVar268 * fVar172 - fVar244 * fVar164;
        auVar158._0_4_ = fVar251 * 0.0 + fVar137 * 0.0 + fVar221;
        auVar158._4_4_ = fVar263 * 0.0 + fVar150 * 0.0 + fVar222;
        auVar158._8_4_ = fVar267 * 0.0 + fVar162 * 0.0 + fVar234;
        auVar158._12_4_ = fVar253 * 0.0 + fVar208 * 0.0 + fVar244;
        auVar51 = rcpps(auVar8,auVar158);
        fVar149 = auVar51._0_4_;
        fVar151 = auVar51._4_4_;
        fVar165 = auVar51._8_4_;
        fVar197 = auVar51._12_4_;
        fVar149 = (1.0 - auVar158._0_4_ * fVar149) * fVar149 + fVar149;
        fVar151 = (1.0 - auVar158._4_4_ * fVar151) * fVar151 + fVar151;
        fVar165 = (1.0 - auVar158._8_4_ * fVar165) * fVar165 + fVar165;
        fVar197 = (1.0 - auVar158._12_4_ * fVar197) * fVar197 + fVar197;
        fVar203 = (fVar203 * fVar221 + fVar247 * fVar137 + fVar198 * fVar251) * fVar149;
        fVar150 = (fVar205 * fVar222 + fVar255 * fVar150 + fVar204 * fVar263) * fVar151;
        fVar162 = (fVar219 * fVar234 + fVar265 * fVar162 + fVar248 * fVar267) * fVar165;
        fVar208 = (fVar220 * fVar244 + fVar249 * fVar208 + fVar252 * fVar253) * fVar197;
        fVar137 = *(float *)(ray + k * 4 + 0x80);
        bVar27 = (fVar114 <= fVar203 && fVar203 <= fVar137) && bVar27;
        auVar143._0_4_ = -(uint)bVar27;
        bVar28 = (fVar114 <= fVar150 && fVar150 <= fVar137) && bVar28;
        auVar143._4_4_ = -(uint)bVar28;
        bVar26 = (fVar114 <= fVar162 && fVar162 <= fVar137) && bVar26;
        auVar143._8_4_ = -(uint)bVar26;
        bVar25 = (fVar114 <= fVar208 && fVar208 <= fVar137) && bVar25;
        auVar143._12_4_ = -(uint)bVar25;
        iVar33 = movmskps(iVar33,auVar143);
        if (iVar33 == 0) goto LAB_0030927e;
        auVar144._0_8_ =
             CONCAT44(-(uint)(auVar158._4_4_ != 0.0 && bVar28),
                      -(uint)(auVar158._0_4_ != 0.0 && bVar27));
        auVar144._8_4_ = -(uint)(auVar158._8_4_ != 0.0 && bVar26);
        auVar144._12_4_ = -(uint)(auVar158._12_4_ != 0.0 && bVar25);
        iVar33 = movmskps(iVar33,auVar144);
        auVar70._8_8_ = uStack_380;
        auVar70._0_8_ = local_388;
        if (iVar33 != 0) {
          fVar195 = fVar195 * fVar149;
          fVar196 = fVar196 * fVar151;
          fVar235 = fVar235 * fVar165;
          fVar245 = fVar245 * fVar197;
          fVar223 = (float)((uint)(1.0 - fVar195) & uVar45 | ~uVar45 & (uint)fVar195);
          fVar226 = (float)((uint)(1.0 - fVar196) & uVar46 | ~uVar46 & (uint)fVar196);
          fVar228 = (float)((uint)(1.0 - fVar235) & uVar47 | ~uVar47 & (uint)fVar235);
          fVar231 = (float)((uint)(1.0 - fVar245) & uVar48 | ~uVar48 & (uint)fVar245);
          local_288 = (float)(~uVar45 & (uint)(auVar273._0_4_ * fVar149) |
                             (uint)(1.0 - auVar273._0_4_ * fVar149) & uVar45);
          fStack_284 = (float)(~uVar46 & (uint)(auVar273._4_4_ * fVar151) |
                              (uint)(1.0 - auVar273._4_4_ * fVar151) & uVar46);
          fStack_280 = (float)(~uVar47 & (uint)(auVar273._8_4_ * fVar165) |
                              (uint)(1.0 - auVar273._8_4_ * fVar165) & uVar47);
          fStack_27c = (float)(~uVar48 & (uint)(auVar273._12_4_ * fVar197) |
                              (uint)(1.0 - auVar273._12_4_ * fVar197) & uVar48);
          auVar70._8_4_ = auVar144._8_4_;
          auVar70._0_8_ = auVar144._0_8_;
          auVar70._12_4_ = auVar144._12_4_;
          fVar49 = fVar203;
          fVar76 = fVar150;
          fVar78 = fVar162;
          fVar81 = fVar208;
        }
      }
      uVar45 = movmskps(iVar33,auVar70);
      pauVar31 = (undefined1 (*) [16])(ulong)uVar45;
      if (uVar45 != 0) {
        fVar152 = (auVar116._0_4_ - fVar152) * fVar223 + fVar152;
        fVar163 = (auVar116._4_4_ - fVar163) * fVar226 + fVar163;
        fVar166 = (auVar116._8_4_ - fVar166) * fVar228 + fVar166;
        fVar168 = (auVar116._12_4_ - fVar168) * fVar231 + fVar168;
        fVar137 = *(float *)((long)local_310->ray_space + k * 4 + -0x10);
        bhit.valid.field_0._0_4_ = -(uint)(fVar137 * (fVar152 + fVar152) < fVar49) & auVar70._0_4_;
        bhit.valid.field_0._4_4_ = -(uint)(fVar137 * (fVar163 + fVar163) < fVar76) & auVar70._4_4_;
        bhit.valid.field_0._8_4_ = -(uint)(fVar137 * (fVar166 + fVar166) < fVar78) & auVar70._8_4_;
        bhit.valid.field_0._12_4_ = -(uint)(fVar137 * (fVar168 + fVar168) < fVar81) & auVar70._12_4_
        ;
        uVar45 = movmskps((int)local_310,(undefined1  [16])bhit.valid.field_0);
        pauVar31 = (undefined1 (*) [16])(ulong)uVar45;
        if (uVar45 != 0) {
          local_288 = local_288 + local_288 + -1.0;
          fStack_284 = fStack_284 + fStack_284 + -1.0;
          fStack_280 = fStack_280 + fStack_280 + -1.0;
          fStack_27c = fStack_27c + fStack_27c + -1.0;
          bhit.U.field_0.v[1] = fVar226;
          bhit.U.field_0.v[0] = fVar223;
          bhit.U.field_0.v[2] = fVar228;
          bhit.U.field_0.v[3] = fVar231;
          bhit.T.field_0.v[1] = fVar76;
          bhit.T.field_0.v[0] = fVar49;
          bhit.T.field_0.v[2] = fVar78;
          bhit.T.field_0.v[3] = fVar81;
          bhit.i = 0;
          if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (uVar40 = CONCAT71((int7)((ulong)context->args >> 8),1),
               pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              fVar137 = 1.0 / fVar121;
              bhit.vu.field_0.v[0] = fVar137 * (fVar223 + 0.0);
              bhit.vu.field_0.v[1] = fVar137 * (fVar226 + 1.0);
              bhit.vu.field_0.v[2] = fVar137 * (fVar228 + 2.0);
              bhit.vu.field_0.v[3] = fVar137 * (fVar231 + 3.0);
              bhit.vv.field_0._0_8_ = CONCAT44(fStack_284,local_288);
              bhit.vv.field_0._8_8_ = CONCAT44(fStack_27c,fStack_280);
              bhit.vt.field_0.v[1] = fVar76;
              bhit.vt.field_0.v[0] = fVar49;
              bhit.vt.field_0.v[2] = fVar78;
              bhit.vt.field_0.v[3] = fVar81;
              pGVar36 = (Geometry *)(ulong)(byte)uVar45;
              uVar40 = 0;
              if (pGVar36 != (Geometry *)0x0) {
                for (; ((byte)uVar45 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                }
              }
              local_4d8 = CONCAT44((uint)uStack_4d0,(uint)uStack_4d0);
              uStack_4d0._4_4_ = (uint)uStack_4d0;
              local_3f8 = CONCAT44(uVar44,uVar44);
              uStack_3f0._0_4_ = (float)uVar44;
              uStack_3f0._4_4_ = uVar44;
              auVar51 = *local_318;
              pauVar31 = local_318;
              bhit.V.field_0.v[0] = local_288;
              bhit.V.field_0.v[1] = fStack_284;
              bhit.V.field_0.v[2] = fStack_280;
              bhit.V.field_0.v[3] = fStack_27c;
              bhit.N = iVar6;
              while (pGVar36 != (Geometry *)0x0) {
                local_e8 = bhit.vu.field_0.v[uVar40];
                uVar43 = *(undefined4 *)(ray + k * 4 + 0x80);
                local_d8 = bhit.vv.field_0.v[uVar40];
                *(float *)(ray + k * 4 + 0x80) = bhit.vt.field_0.v[uVar40];
                fVar162 = 1.0 - local_e8;
                fVar137 = local_e8 * 3.0;
                fVar151 = ((fVar137 + 2.0) * (fVar162 + fVar162) + fVar162 * -3.0 * fVar162) * 0.5;
                fVar149 = (local_e8 * local_e8 + fVar162 * -2.0 * local_e8) * 0.5;
                fVar150 = (local_e8 * fVar137 + (fVar137 + -5.0) * (local_e8 + local_e8)) * 0.5;
                args.context = context->user;
                fVar137 = (local_e8 * (fVar162 + fVar162) - fVar162 * fVar162) * 0.5;
                local_118 = fVar137 * local_348 +
                            fVar150 * local_358 + fVar151 * local_368 + fVar149 * local_378;
                local_108 = fVar137 * fStack_344 +
                            fVar150 * fStack_354 + fVar151 * fStack_364 + fVar149 * fStack_374;
                local_f8 = fVar137 * fStack_340 +
                           fVar150 * fStack_350 + fVar151 * fStack_360 + fVar149 * fStack_370;
                fStack_114 = local_118;
                fStack_110 = local_118;
                fStack_10c = local_118;
                fStack_104 = local_108;
                fStack_100 = local_108;
                fStack_fc = local_108;
                fStack_f4 = local_f8;
                fStack_f0 = local_f8;
                fStack_ec = local_f8;
                fStack_e4 = local_e8;
                fStack_e0 = local_e8;
                fStack_dc = local_e8;
                fStack_d4 = local_d8;
                fStack_d0 = local_d8;
                fStack_cc = local_d8;
                local_c8 = local_3f8;
                uStack_c0 = uStack_3f0;
                local_b8 = local_4d8;
                uStack_b0 = uStack_4d0;
                local_a8 = (args.context)->instID[0];
                uStack_a4 = local_a8;
                uStack_a0 = local_a8;
                uStack_9c = local_a8;
                local_98 = (args.context)->instPrimID[0];
                uStack_94 = local_98;
                uStack_90 = local_98;
                uStack_8c = local_98;
                args.valid = (int *)local_3a8;
                pRVar34 = (RTCIntersectArguments *)pGVar7->userPtr;
                args.hit = (RTCHitN *)&local_118;
                args.N = 4;
                p_Var29 = pGVar7->occlusionFilterN;
                local_3a8 = auVar51;
                args.geometryUserPtr = pRVar34;
                args.ray = (RTCRayN *)ray;
                if (p_Var29 != (RTCFilterFunctionN)0x0) {
                  p_Var29 = (RTCFilterFunctionN)(*p_Var29)(&args);
                }
                auVar103._0_4_ = -(uint)(local_3a8._0_4_ == 0);
                auVar103._4_4_ = -(uint)(local_3a8._4_4_ == 0);
                auVar103._8_4_ = -(uint)(local_3a8._8_4_ == 0);
                auVar103._12_4_ = -(uint)(local_3a8._12_4_ == 0);
                uVar45 = movmskps((int)p_Var29,auVar103);
                pRVar30 = (RTCRayN *)(ulong)(uVar45 ^ 0xf);
                if ((uVar45 ^ 0xf) == 0) {
                  auVar103 = auVar103 ^ _DAT_01f46b70;
                }
                else {
                  pRVar34 = context->args;
                  if ((pRVar34->filter != (RTCFilterFunctionN)0x0) &&
                     (((pRVar34->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*pRVar34->filter)(&args);
                  }
                  auVar71._0_4_ = -(uint)(local_3a8._0_4_ == 0);
                  auVar71._4_4_ = -(uint)(local_3a8._4_4_ == 0);
                  auVar71._8_4_ = -(uint)(local_3a8._8_4_ == 0);
                  auVar71._12_4_ = -(uint)(local_3a8._12_4_ == 0);
                  auVar103 = auVar71 ^ _DAT_01f46b70;
                  *(undefined1 (*) [16])(args.ray + 0x80) =
                       ~auVar71 & _DAT_01f45a40 | *(undefined1 (*) [16])(args.ray + 0x80) & auVar71;
                  pRVar30 = args.ray;
                }
                auVar104._0_4_ = auVar103._0_4_ << 0x1f;
                auVar104._4_4_ = auVar103._4_4_ << 0x1f;
                auVar104._8_4_ = auVar103._8_4_ << 0x1f;
                auVar104._12_4_ = auVar103._12_4_ << 0x1f;
                iVar33 = movmskps((int)pRVar30,auVar104);
                pauVar31 = (undefined1 (*) [16])(uVar40 & 0xffffffff);
                if (iVar33 != 0) {
                  uVar40 = CONCAT71((int7)((ulong)pRVar34 >> 8),1);
                  goto LAB_00309247;
                }
                *(undefined4 *)(ray + k * 4 + 0x80) = uVar43;
                pGVar36 = (Geometry *)((ulong)pGVar36 ^ 1L << (uVar40 & 0x3f));
                uVar40 = 0;
                if (pGVar36 != (Geometry *)0x0) {
                  for (; ((ulong)pGVar36 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                  }
                }
              }
              uVar40 = 0;
            }
            goto LAB_00309247;
          }
        }
      }
      uVar40 = 0;
    }
LAB_00309247:
    uVar43 = SUB84(pauVar31,0);
    if (4 < iVar6) {
      local_58 = iVar6;
      iStack_54 = iVar6;
      iStack_50 = iVar6;
      iStack_4c = iVar6;
      local_88 = 1.0 / fVar121;
      fStack_84 = local_88;
      fStack_80 = local_88;
      fStack_7c = local_88;
      local_68 = (undefined4)local_390;
      uStack_64 = (undefined4)local_390;
      uStack_60 = (undefined4)local_390;
      uStack_5c = (undefined4)local_390;
      local_78 = uVar44;
      uStack_74 = uVar44;
      uStack_70 = uVar44;
      uStack_6c = uVar44;
      for (lVar38 = 4; uVar43 = SUB84(pauVar31,0), lVar38 < iVar6; lVar38 = lVar38 + 4) {
        bhit.i = (int)lVar38;
        pauVar2 = (undefined1 (*) [12])(catmullrom_basis0 + lVar38 * 4 + lVar37);
        fVar121 = *(float *)*pauVar2;
        fVar137 = *(float *)(*pauVar2 + 4);
        fVar149 = *(float *)(*pauVar2 + 8);
        auVar12 = *pauVar2;
        fVar150 = *(float *)pauVar2[1];
        pauVar2 = (undefined1 (*) [12])(lVar37 + 0x22047f0 + lVar38 * 4);
        fVar151 = *(float *)*pauVar2;
        fVar162 = *(float *)(*pauVar2 + 4);
        fVar165 = *(float *)(*pauVar2 + 8);
        auVar11 = *pauVar2;
        fVar208 = *(float *)pauVar2[1];
        pauVar2 = (undefined1 (*) [12])(lVar37 + 0x2204c74 + lVar38 * 4);
        fVar197 = *(float *)*pauVar2;
        fVar203 = *(float *)(*pauVar2 + 4);
        fVar205 = *(float *)(*pauVar2 + 8);
        auVar10 = *pauVar2;
        fVar219 = *(float *)pauVar2[1];
        pfVar1 = (float *)(lVar37 + 0x22050f8 + lVar38 * 4);
        fVar220 = *pfVar1;
        fVar221 = pfVar1[1];
        fVar222 = pfVar1[2];
        fVar234 = pfVar1[3];
        fVar171 = fVar213 * fVar121 + local_338 * fVar151 + fVar215 * fVar197 + fVar122 * fVar220;
        fVar172 = fVar213 * fVar137 + fStack_334 * fVar162 + fVar215 * fVar203 + fVar122 * fVar221;
        fVar190 = fVar213 * fVar149 + fStack_330 * fVar165 + fVar215 * fVar205 + fVar122 * fVar222;
        fVar191 = fVar213 * fVar150 + fStack_32c * fVar208 + fVar215 * fVar219 + fVar122 * fVar234;
        fVar193 = fVar170 * fVar121 + fVar189 * fVar151 + fVar218 * fVar197 + fVar131 * fVar220;
        fVar195 = fVar170 * fVar137 + fVar189 * fVar162 + fVar218 * fVar203 + fVar131 * fVar221;
        fVar235 = fVar170 * fVar149 + fVar189 * fVar165 + fVar218 * fVar205 + fVar131 * fVar222;
        fVar248 = fVar170 * fVar150 + fVar189 * fVar208 + fVar218 * fVar219 + fVar131 * fVar234;
        auVar260._0_4_ =
             fVar133 * fVar121 + fVar84 * fVar151 + fVar109 * fVar197 + fVar111 * fVar220;
        auVar260._4_4_ =
             fVar133 * fVar137 + fVar84 * fVar162 + fVar109 * fVar203 + fVar111 * fVar221;
        auVar260._8_4_ =
             fVar133 * fVar149 + fVar84 * fVar165 + fVar109 * fVar205 + fVar111 * fVar222;
        auVar260._12_4_ =
             fVar133 * fVar150 + fVar84 * fVar208 + fVar109 * fVar219 + fVar111 * fVar234;
        pauVar31 = (undefined1 (*) [16])(catmullrom_basis1 + lVar37);
        pfVar1 = (float *)(*pauVar31 + lVar38 * 4);
        fVar121 = *pfVar1;
        fVar137 = pfVar1[1];
        fVar149 = pfVar1[2];
        fVar151 = pfVar1[3];
        pfVar1 = (float *)(lVar37 + 0x2206c10 + lVar38 * 4);
        fVar162 = *pfVar1;
        fVar165 = pfVar1[1];
        fVar197 = pfVar1[2];
        fVar203 = pfVar1[3];
        pfVar1 = (float *)(lVar37 + 0x2207094 + lVar38 * 4);
        fVar205 = *pfVar1;
        fVar244 = pfVar1[1];
        fVar247 = pfVar1[2];
        fVar251 = pfVar1[3];
        pfVar1 = (float *)(lVar37 + 0x2207518 + lVar38 * 4);
        fVar255 = *pfVar1;
        fVar263 = pfVar1[1];
        fVar265 = pfVar1[2];
        fVar267 = pfVar1[3];
        fVar132 = fVar213 * fVar121 + local_338 * fVar162 + fVar215 * fVar205 + fVar122 * fVar255;
        fVar134 = fVar213 * fVar137 + fStack_334 * fVar165 + fVar215 * fVar244 + fVar122 * fVar263;
        fVar135 = fVar213 * fVar149 + fStack_330 * fVar197 + fVar215 * fVar247 + fVar122 * fVar265;
        fVar136 = fVar213 * fVar151 + fStack_32c * fVar203 + fVar215 * fVar251 + fVar122 * fVar267;
        fVar152 = fVar170 * fVar121 + fVar189 * fVar162 + fVar218 * fVar205 + fVar131 * fVar255;
        fVar166 = fVar170 * fVar137 + fVar189 * fVar165 + fVar218 * fVar244 + fVar131 * fVar263;
        fVar153 = fVar170 * fVar149 + fVar189 * fVar197 + fVar218 * fVar247 + fVar131 * fVar265;
        fVar167 = fVar170 * fVar151 + fVar189 * fVar203 + fVar218 * fVar251 + fVar131 * fVar267;
        auVar242._0_4_ =
             fVar133 * fVar121 + fVar84 * fVar162 + fVar109 * fVar205 + fVar111 * fVar255;
        auVar242._4_4_ =
             fVar133 * fVar137 + fVar84 * fVar165 + fVar109 * fVar244 + fVar111 * fVar263;
        auVar242._8_4_ =
             fVar133 * fVar149 + fVar84 * fVar197 + fVar109 * fVar247 + fVar111 * fVar265;
        auVar242._12_4_ =
             fVar133 * fVar151 + fVar84 * fVar203 + fVar109 * fVar251 + fVar111 * fVar267;
        fVar249 = fVar132 - fVar171;
        fVar253 = fVar134 - fVar172;
        fVar199 = fVar135 - fVar190;
        fVar123 = fVar136 - fVar191;
        fVar163 = fVar152 - fVar193;
        fVar168 = fVar166 - fVar195;
        fVar164 = fVar153 - fVar235;
        fVar169 = fVar167 - fVar248;
        fVar194 = fVar193 * fVar249 - fVar171 * fVar163;
        fVar196 = fVar195 * fVar253 - fVar172 * fVar168;
        fVar245 = fVar235 * fVar199 - fVar190 * fVar164;
        fVar252 = fVar248 * fVar123 - fVar191 * fVar169;
        auVar51 = maxps(auVar260,auVar242);
        bVar27 = fVar194 * fVar194 <=
                 auVar51._0_4_ * auVar51._0_4_ * (fVar249 * fVar249 + fVar163 * fVar163) &&
                 bhit.i < local_58;
        auVar201._0_4_ = -(uint)bVar27;
        bVar28 = fVar196 * fVar196 <=
                 auVar51._4_4_ * auVar51._4_4_ * (fVar253 * fVar253 + fVar168 * fVar168) &&
                 (int)(bhit.i | 1U) < iStack_54;
        auVar201._4_4_ = -(uint)bVar28;
        bVar26 = fVar245 * fVar245 <=
                 auVar51._8_4_ * auVar51._8_4_ * (fVar199 * fVar199 + fVar164 * fVar164) &&
                 (int)(bhit.i | 2U) < iStack_50;
        auVar201._8_4_ = -(uint)bVar26;
        bVar25 = fVar252 * fVar252 <=
                 auVar51._12_4_ * auVar51._12_4_ * (fVar123 * fVar123 + fVar169 * fVar169) &&
                 (int)(bhit.i | 3U) < iStack_4c;
        auVar201._12_4_ = -(uint)bVar25;
        uVar44 = movmskps((int)pGVar36,auVar201);
        pGVar36 = (Geometry *)(ulong)uVar44;
        if (uVar44 == 0) {
          uVar35 = uVar40 & 0xffffffff;
        }
        else {
          fVar254 = fVar255 * fVar120 + fVar205 * local_328 + fVar162 * fVar214 + fVar121 * fVar192;
          fVar77 = fVar263 * fVar120 + fVar244 * fStack_324 + fVar165 * fVar214 + fVar137 * fVar192;
          fVar82 = fVar265 * fVar120 + fVar247 * fStack_320 + fVar197 * fVar214 + fVar149 * fVar192;
          fVar110 = fVar267 * fVar120 + fVar251 * fStack_31c + fVar203 * fVar214 + fVar151 * fVar192
          ;
          local_3d8 = auVar12._0_4_;
          fStack_3d4 = auVar12._4_4_;
          fStack_3d0 = auVar12._8_4_;
          local_278 = auVar11._0_4_;
          fStack_274 = auVar11._4_4_;
          fStack_270 = auVar11._8_4_;
          local_2c8 = auVar10._0_4_;
          fStack_2c4 = auVar10._4_4_;
          fStack_2c0 = auVar10._8_4_;
          fVar50 = fVar220 * fVar120 + local_2c8 * local_328 + local_278 * fVar214 +
                   local_3d8 * fVar192;
          fVar79 = fVar221 * fVar120 + fStack_2c4 * fStack_324 + fStack_274 * fVar214 +
                   fStack_3d4 * fVar192;
          fVar85 = fVar222 * fVar120 + fStack_2c0 * fStack_320 + fStack_270 * fVar214 +
                   fStack_3d0 * fVar192;
          fVar112 = fVar234 * fVar120 + fVar219 * fStack_31c + fVar208 * fVar214 + fVar150 * fVar192
          ;
          pfVar1 = (float *)(lVar37 + 0x220557c + lVar38 * 4);
          fVar121 = *pfVar1;
          fVar137 = pfVar1[1];
          fVar149 = pfVar1[2];
          fVar150 = pfVar1[3];
          pfVar1 = (float *)(lVar37 + 0x2205a00 + lVar38 * 4);
          fVar151 = *pfVar1;
          fVar162 = pfVar1[1];
          fVar165 = pfVar1[2];
          fVar208 = pfVar1[3];
          pfVar1 = (float *)(lVar37 + 0x2205e84 + lVar38 * 4);
          fVar197 = *pfVar1;
          fVar203 = pfVar1[1];
          fVar205 = pfVar1[2];
          fVar219 = pfVar1[3];
          pfVar1 = (float *)(lVar37 + 0x2206308 + lVar38 * 4);
          fVar220 = *pfVar1;
          fVar221 = pfVar1[1];
          fVar222 = pfVar1[2];
          fVar234 = pfVar1[3];
          fVar207 = fVar213 * fVar121 + local_338 * fVar151 + fVar215 * fVar197 + fVar122 * fVar220;
          fVar224 = fVar213 * fVar137 + fStack_334 * fVar162 + fVar215 * fVar203 + fVar122 * fVar221
          ;
          fVar227 = fVar213 * fVar149 + fStack_330 * fVar165 + fVar215 * fVar205 + fVar122 * fVar222
          ;
          fVar229 = fVar213 * fVar150 + fStack_32c * fVar208 + fVar215 * fVar219 + fVar122 * fVar234
          ;
          fVar233 = fVar170 * fVar121 + fVar189 * fVar151 + fVar218 * fVar197 + fVar131 * fVar220;
          fVar236 = fVar170 * fVar137 + fVar189 * fVar162 + fVar218 * fVar203 + fVar131 * fVar221;
          fVar246 = fVar170 * fVar149 + fVar189 * fVar165 + fVar218 * fVar205 + fVar131 * fVar222;
          fVar250 = fVar170 * fVar150 + fVar189 * fVar208 + fVar218 * fVar219 + fVar131 * fVar234;
          pfVar1 = (float *)(lVar37 + 0x220799c + lVar38 * 4);
          fVar244 = *pfVar1;
          fVar247 = pfVar1[1];
          fVar251 = pfVar1[2];
          fVar255 = pfVar1[3];
          pfVar1 = (float *)(lVar37 + 0x22082a4 + lVar38 * 4);
          fVar263 = *pfVar1;
          fVar265 = pfVar1[1];
          fVar267 = pfVar1[2];
          fVar194 = pfVar1[3];
          pfVar1 = (float *)(lVar37 + 0x2208728 + lVar38 * 4);
          fVar196 = *pfVar1;
          fVar245 = pfVar1[1];
          fVar252 = pfVar1[2];
          fVar256 = pfVar1[3];
          pfVar1 = (float *)(lVar37 + 0x2207e20 + lVar38 * 4);
          fVar264 = *pfVar1;
          fVar266 = pfVar1[1];
          fVar268 = pfVar1[2];
          fVar230 = pfVar1[3];
          fVar232 = fVar213 * fVar244 + local_338 * fVar264 + fVar215 * fVar263 + fVar122 * fVar196;
          fVar269 = fVar213 * fVar247 + fStack_334 * fVar266 + fVar215 * fVar265 + fVar122 * fVar245
          ;
          fVar275 = fVar213 * fVar251 + fStack_330 * fVar268 + fVar215 * fVar267 + fVar122 * fVar252
          ;
          fVar276 = fVar213 * fVar255 + fStack_32c * fVar230 + fVar215 * fVar194 + fVar122 * fVar256
          ;
          fVar113 = fVar170 * fVar244 + fVar189 * fVar264 + fVar218 * fVar263 + fVar131 * fVar196;
          fVar198 = fVar170 * fVar247 + fVar189 * fVar266 + fVar218 * fVar265 + fVar131 * fVar245;
          fVar204 = fVar170 * fVar251 + fVar189 * fVar268 + fVar218 * fVar267 + fVar131 * fVar252;
          fVar206 = fVar170 * fVar255 + fVar189 * fVar230 + fVar218 * fVar194 + fVar131 * fVar256;
          auVar243._0_8_ = CONCAT44(fVar224,fVar207) & 0x7fffffff7fffffff;
          auVar243._8_4_ = ABS(fVar227);
          auVar243._12_4_ = ABS(fVar229);
          auVar159._0_8_ = CONCAT44(fVar236,fVar233) & 0x7fffffff7fffffff;
          auVar159._8_4_ = ABS(fVar246);
          auVar159._12_4_ = ABS(fVar250);
          auVar51 = maxps(auVar243,auVar159);
          auVar261._0_8_ =
               CONCAT44(fVar137 * fVar192 +
                        fVar162 * fVar214 + fVar203 * fStack_324 + fVar221 * fVar120,
                        fVar121 * fVar192 +
                        fVar151 * fVar214 + fVar197 * local_328 + fVar220 * fVar120) &
               0x7fffffff7fffffff;
          auVar261._8_4_ =
               ABS(fVar149 * fVar192 + fVar165 * fVar214 + fVar205 * fStack_320 + fVar222 * fVar120)
          ;
          auVar261._12_4_ =
               ABS(fVar150 * fVar192 + fVar208 * fVar214 + fVar219 * fStack_31c + fVar234 * fVar120)
          ;
          auVar51 = maxps(auVar51,auVar261);
          uVar44 = -(uint)(local_3e8 <= auVar51._0_4_);
          uVar45 = -(uint)(local_3e8 <= auVar51._4_4_);
          uVar46 = -(uint)(local_3e8 <= auVar51._8_4_);
          uVar47 = -(uint)(local_3e8 <= auVar51._12_4_);
          auVar160._0_4_ = ~uVar44 & (uint)fVar249;
          auVar160._4_4_ = ~uVar45 & (uint)fVar253;
          auVar160._8_4_ = ~uVar46 & (uint)fVar199;
          auVar160._12_4_ = ~uVar47 & (uint)fVar123;
          auVar225._0_4_ = (uint)fVar207 & uVar44;
          auVar225._4_4_ = (uint)fVar224 & uVar45;
          auVar225._8_4_ = (uint)fVar227 & uVar46;
          auVar225._12_4_ = (uint)fVar229 & uVar47;
          auVar225 = auVar225 | auVar160;
          fVar203 = (float)(~uVar44 & (uint)fVar163 | (uint)fVar233 & uVar44);
          fVar219 = (float)(~uVar45 & (uint)fVar168 | (uint)fVar236 & uVar45);
          fVar233 = (float)(~uVar46 & (uint)fVar164 | (uint)fVar246 & uVar46);
          fVar246 = (float)(~uVar47 & (uint)fVar169 | (uint)fVar250 & uVar47);
          auVar262._0_8_ = CONCAT44(fVar269,fVar232) & 0x7fffffff7fffffff;
          auVar262._8_4_ = ABS(fVar275);
          auVar262._12_4_ = ABS(fVar276);
          auVar117._0_8_ = CONCAT44(fVar198,fVar113) & 0x7fffffff7fffffff;
          auVar117._8_4_ = ABS(fVar204);
          auVar117._12_4_ = ABS(fVar206);
          auVar51 = maxps(auVar262,auVar117);
          auVar72._0_8_ =
               CONCAT44(fVar247 * fVar192 +
                        fVar266 * fVar214 + fVar265 * fStack_324 + fVar245 * fVar120,
                        fVar244 * fVar192 +
                        fVar264 * fVar214 + fVar263 * local_328 + fVar196 * fVar120) &
               0x7fffffff7fffffff;
          auVar72._8_4_ =
               ABS(fVar251 * fVar192 + fVar268 * fVar214 + fVar267 * fStack_320 + fVar252 * fVar120)
          ;
          auVar72._12_4_ =
               ABS(fVar255 * fVar192 + fVar230 * fVar214 + fVar194 * fStack_31c + fVar256 * fVar120)
          ;
          auVar51 = maxps(auVar51,auVar72);
          uVar44 = -(uint)(local_3e8 <= auVar51._0_4_);
          uVar45 = -(uint)(local_3e8 <= auVar51._4_4_);
          uVar46 = -(uint)(local_3e8 <= auVar51._8_4_);
          uVar47 = -(uint)(local_3e8 <= auVar51._12_4_);
          fVar256 = (float)((uint)fVar232 & uVar44 | ~uVar44 & (uint)fVar249);
          fVar253 = (float)((uint)fVar269 & uVar45 | ~uVar45 & (uint)fVar253);
          fVar264 = (float)((uint)fVar275 & uVar46 | ~uVar46 & (uint)fVar199);
          fVar123 = (float)((uint)fVar276 & uVar47 | ~uVar47 & (uint)fVar123);
          fVar244 = (float)(~uVar44 & (uint)fVar163 | (uint)fVar113 & uVar44);
          fVar251 = (float)(~uVar45 & (uint)fVar168 | (uint)fVar198 & uVar45);
          fVar263 = (float)(~uVar46 & (uint)fVar164 | (uint)fVar204 & uVar46);
          fVar267 = (float)(~uVar47 & (uint)fVar169 | (uint)fVar206 & uVar47);
          fVar208 = auVar225._0_4_;
          fVar121 = auVar225._4_4_;
          fVar137 = auVar225._8_4_;
          fVar149 = auVar225._12_4_;
          auVar145._0_4_ = fVar203 * fVar203 + fVar208 * fVar208;
          auVar145._4_4_ = fVar219 * fVar219 + fVar121 * fVar121;
          auVar145._8_4_ = fVar233 * fVar233 + fVar137 * fVar137;
          auVar145._12_4_ = fVar246 * fVar246 + fVar149 * fVar149;
          auVar51 = rsqrtps(auVar160,auVar145);
          fVar150 = auVar51._0_4_;
          fVar151 = auVar51._4_4_;
          fVar162 = auVar51._8_4_;
          fVar165 = auVar51._12_4_;
          auVar161._0_4_ = fVar150 * fVar150 * auVar145._0_4_ * 0.5 * fVar150;
          auVar161._4_4_ = fVar151 * fVar151 * auVar145._4_4_ * 0.5 * fVar151;
          auVar161._8_4_ = fVar162 * fVar162 * auVar145._8_4_ * 0.5 * fVar162;
          auVar161._12_4_ = fVar165 * fVar165 * auVar145._12_4_ * 0.5 * fVar165;
          fVar220 = fVar150 * 1.5 - auVar161._0_4_;
          fVar221 = fVar151 * 1.5 - auVar161._4_4_;
          fVar222 = fVar162 * 1.5 - auVar161._8_4_;
          fVar234 = fVar165 * 1.5 - auVar161._12_4_;
          auVar146._0_4_ = fVar244 * fVar244 + fVar256 * fVar256;
          auVar146._4_4_ = fVar251 * fVar251 + fVar253 * fVar253;
          auVar146._8_4_ = fVar263 * fVar263 + fVar264 * fVar264;
          auVar146._12_4_ = fVar267 * fVar267 + fVar123 * fVar123;
          auVar51 = rsqrtps(auVar161,auVar146);
          fVar150 = auVar51._0_4_;
          fVar151 = auVar51._4_4_;
          fVar162 = auVar51._8_4_;
          fVar165 = auVar51._12_4_;
          fVar197 = fVar150 * 1.5 - fVar150 * fVar150 * auVar146._0_4_ * 0.5 * fVar150;
          fVar151 = fVar151 * 1.5 - fVar151 * fVar151 * auVar146._4_4_ * 0.5 * fVar151;
          fVar205 = fVar162 * 1.5 - fVar162 * fVar162 * auVar146._8_4_ * 0.5 * fVar162;
          fVar165 = fVar165 * 1.5 - fVar165 * fVar165 * auVar146._12_4_ * 0.5 * fVar165;
          fVar199 = fVar203 * fVar220 * auVar260._0_4_;
          fVar169 = fVar219 * fVar221 * auVar260._4_4_;
          fVar236 = fVar233 * fVar222 * auVar260._8_4_;
          fVar250 = fVar246 * fVar234 * auVar260._12_4_;
          fVar162 = -fVar208 * fVar220 * auVar260._0_4_;
          fVar208 = -fVar121 * fVar221 * auVar260._4_4_;
          fVar203 = -fVar137 * fVar222 * auVar260._8_4_;
          fVar219 = -fVar149 * fVar234 * auVar260._12_4_;
          fVar247 = fVar220 * 0.0 * auVar260._0_4_;
          fVar255 = fVar221 * 0.0 * auVar260._4_4_;
          fVar265 = fVar222 * 0.0 * auVar260._8_4_;
          fVar249 = fVar234 * 0.0 * auVar260._12_4_;
          fVar164 = fVar244 * fVar197 * auVar242._0_4_;
          fVar198 = fVar251 * fVar151 * auVar242._4_4_;
          fVar204 = fVar263 * fVar205 * auVar242._8_4_;
          fVar206 = fVar267 * fVar165 * auVar242._12_4_;
          fVar194 = fVar132 + fVar164;
          fVar196 = fVar134 + fVar198;
          fVar245 = fVar135 + fVar204;
          fVar252 = fVar136 + fVar206;
          fVar121 = -fVar256 * fVar197 * auVar242._0_4_;
          fVar137 = -fVar253 * fVar151 * auVar242._4_4_;
          fVar149 = -fVar264 * fVar205 * auVar242._8_4_;
          fVar150 = -fVar123 * fVar165 * auVar242._12_4_;
          fVar256 = fVar152 + fVar121;
          fVar264 = fVar166 + fVar137;
          fVar266 = fVar153 + fVar149;
          fVar268 = fVar167 + fVar150;
          fVar220 = fVar197 * 0.0 * auVar242._0_4_;
          fVar221 = fVar151 * 0.0 * auVar242._4_4_;
          fVar222 = fVar205 * 0.0 * auVar242._8_4_;
          fVar234 = fVar165 * 0.0 * auVar242._12_4_;
          fVar253 = fVar171 - fVar199;
          fVar123 = fVar172 - fVar169;
          fVar163 = fVar190 - fVar236;
          fVar168 = fVar191 - fVar250;
          fVar230 = fVar254 + fVar220;
          fVar233 = fVar77 + fVar221;
          fVar246 = fVar82 + fVar222;
          fVar113 = fVar110 + fVar234;
          fVar151 = fVar193 - fVar162;
          fVar165 = fVar195 - fVar208;
          fVar197 = fVar235 - fVar203;
          fVar205 = fVar248 - fVar219;
          fVar244 = fVar50 - fVar247;
          fVar251 = fVar79 - fVar255;
          fVar263 = fVar85 - fVar265;
          fVar267 = fVar112 - fVar249;
          uVar44 = -(uint)(0.0 < (fVar151 * (fVar230 - fVar244) - fVar244 * (fVar256 - fVar151)) *
                                 0.0 + (fVar244 * (fVar194 - fVar253) -
                                       (fVar230 - fVar244) * fVar253) * 0.0 +
                                       ((fVar256 - fVar151) * fVar253 -
                                       (fVar194 - fVar253) * fVar151));
          uVar45 = -(uint)(0.0 < (fVar165 * (fVar233 - fVar251) - fVar251 * (fVar264 - fVar165)) *
                                 0.0 + (fVar251 * (fVar196 - fVar123) -
                                       (fVar233 - fVar251) * fVar123) * 0.0 +
                                       ((fVar264 - fVar165) * fVar123 -
                                       (fVar196 - fVar123) * fVar165));
          uVar46 = -(uint)(0.0 < (fVar197 * (fVar246 - fVar263) - fVar263 * (fVar266 - fVar197)) *
                                 0.0 + (fVar263 * (fVar245 - fVar163) -
                                       (fVar246 - fVar263) * fVar163) * 0.0 +
                                       ((fVar266 - fVar197) * fVar163 -
                                       (fVar245 - fVar163) * fVar197));
          uVar47 = -(uint)(0.0 < (fVar205 * (fVar113 - fVar267) - fVar267 * (fVar268 - fVar205)) *
                                 0.0 + (fVar267 * (fVar252 - fVar168) -
                                       (fVar113 - fVar267) * fVar168) * 0.0 +
                                       ((fVar268 - fVar205) * fVar168 -
                                       (fVar252 - fVar168) * fVar205));
          fVar164 = (float)((uint)(fVar132 - fVar164) & uVar44 | ~uVar44 & (uint)(fVar171 + fVar199)
                           );
          fVar169 = (float)((uint)(fVar134 - fVar198) & uVar45 | ~uVar45 & (uint)(fVar172 + fVar169)
                           );
          fVar171 = (float)((uint)(fVar135 - fVar204) & uVar46 | ~uVar46 & (uint)(fVar190 + fVar236)
                           );
          fVar136 = (float)((uint)(fVar136 - fVar206) & uVar47 | ~uVar47 & (uint)(fVar191 + fVar250)
                           );
          fVar152 = (float)((uint)(fVar152 - fVar121) & uVar44 | ~uVar44 & (uint)(fVar193 + fVar162)
                           );
          fVar166 = (float)((uint)(fVar166 - fVar137) & uVar45 | ~uVar45 & (uint)(fVar195 + fVar208)
                           );
          fVar153 = (float)((uint)(fVar153 - fVar149) & uVar46 | ~uVar46 & (uint)(fVar235 + fVar203)
                           );
          fVar167 = (float)((uint)(fVar167 - fVar150) & uVar47 | ~uVar47 & (uint)(fVar248 + fVar219)
                           );
          fVar220 = (float)((uint)(fVar254 - fVar220) & uVar44 | ~uVar44 & (uint)(fVar50 + fVar247))
          ;
          fVar221 = (float)((uint)(fVar77 - fVar221) & uVar45 | ~uVar45 & (uint)(fVar79 + fVar255));
          fVar222 = (float)((uint)(fVar82 - fVar222) & uVar46 | ~uVar46 & (uint)(fVar85 + fVar265));
          fVar234 = (float)((uint)(fVar110 - fVar234) & uVar47 | ~uVar47 & (uint)(fVar112 + fVar249)
                           );
          fVar199 = (float)((uint)fVar253 & uVar44 | ~uVar44 & (uint)fVar194);
          fVar132 = (float)((uint)fVar123 & uVar45 | ~uVar45 & (uint)fVar196);
          fVar134 = (float)((uint)fVar163 & uVar46 | ~uVar46 & (uint)fVar245);
          fVar135 = (float)((uint)fVar168 & uVar47 | ~uVar47 & (uint)fVar252);
          fVar162 = (float)((uint)fVar151 & uVar44 | ~uVar44 & (uint)fVar256);
          fVar208 = (float)((uint)fVar165 & uVar45 | ~uVar45 & (uint)fVar264);
          fVar203 = (float)((uint)fVar197 & uVar46 | ~uVar46 & (uint)fVar266);
          fVar219 = (float)((uint)fVar205 & uVar47 | ~uVar47 & (uint)fVar268);
          fVar247 = (float)((uint)fVar244 & uVar44 | ~uVar44 & (uint)fVar230);
          fVar255 = (float)((uint)fVar251 & uVar45 | ~uVar45 & (uint)fVar233);
          fVar265 = (float)((uint)fVar263 & uVar46 | ~uVar46 & (uint)fVar246);
          fVar249 = (float)((uint)fVar267 & uVar47 | ~uVar47 & (uint)fVar113);
          fVar253 = (float)((uint)fVar194 & uVar44 | ~uVar44 & (uint)fVar253) - fVar164;
          fVar123 = (float)((uint)fVar196 & uVar45 | ~uVar45 & (uint)fVar123) - fVar169;
          fVar163 = (float)((uint)fVar245 & uVar46 | ~uVar46 & (uint)fVar163) - fVar171;
          fVar168 = (float)((uint)fVar252 & uVar47 | ~uVar47 & (uint)fVar168) - fVar136;
          fVar172 = (float)((uint)fVar256 & uVar44 | ~uVar44 & (uint)fVar151) - fVar152;
          fVar190 = (float)((uint)fVar264 & uVar45 | ~uVar45 & (uint)fVar165) - fVar166;
          fVar191 = (float)((uint)fVar266 & uVar46 | ~uVar46 & (uint)fVar197) - fVar153;
          fVar193 = (float)((uint)fVar268 & uVar47 | ~uVar47 & (uint)fVar205) - fVar167;
          fVar244 = (float)((uint)fVar230 & uVar44 | ~uVar44 & (uint)fVar244) - fVar220;
          fVar251 = (float)((uint)fVar233 & uVar45 | ~uVar45 & (uint)fVar251) - fVar221;
          fVar263 = (float)((uint)fVar246 & uVar46 | ~uVar46 & (uint)fVar263) - fVar222;
          fVar267 = (float)((uint)fVar113 & uVar47 | ~uVar47 & (uint)fVar267) - fVar234;
          fVar245 = fVar164 - fVar199;
          fVar248 = fVar169 - fVar132;
          fVar252 = fVar171 - fVar134;
          fVar256 = fVar136 - fVar135;
          fVar121 = fVar152 - fVar162;
          fVar137 = fVar166 - fVar208;
          fVar149 = fVar153 - fVar203;
          fVar150 = fVar167 - fVar219;
          fVar151 = fVar220 - fVar247;
          fVar165 = fVar221 - fVar255;
          fVar197 = fVar222 - fVar265;
          fVar205 = fVar234 - fVar249;
          fVar194 = (fVar152 * fVar244 - fVar220 * fVar172) * 0.0 +
                    (fVar220 * fVar253 - fVar164 * fVar244) * 0.0 +
                    (fVar164 * fVar172 - fVar152 * fVar253);
          fVar195 = (fVar166 * fVar251 - fVar221 * fVar190) * 0.0 +
                    (fVar221 * fVar123 - fVar169 * fVar251) * 0.0 +
                    (fVar169 * fVar190 - fVar166 * fVar123);
          auVar129._4_4_ = fVar195;
          auVar129._0_4_ = fVar194;
          fVar196 = (fVar153 * fVar263 - fVar222 * fVar191) * 0.0 +
                    (fVar222 * fVar163 - fVar171 * fVar263) * 0.0 +
                    (fVar171 * fVar191 - fVar153 * fVar163);
          fVar235 = (fVar167 * fVar267 - fVar234 * fVar193) * 0.0 +
                    (fVar234 * fVar168 - fVar136 * fVar267) * 0.0 +
                    (fVar136 * fVar193 - fVar167 * fVar168);
          auVar274._0_4_ =
               (fVar162 * fVar151 - fVar247 * fVar121) * 0.0 +
               (fVar247 * fVar245 - fVar199 * fVar151) * 0.0 +
               (fVar199 * fVar121 - fVar162 * fVar245);
          auVar274._4_4_ =
               (fVar208 * fVar165 - fVar255 * fVar137) * 0.0 +
               (fVar255 * fVar248 - fVar132 * fVar165) * 0.0 +
               (fVar132 * fVar137 - fVar208 * fVar248);
          auVar274._8_4_ =
               (fVar203 * fVar197 - fVar265 * fVar149) * 0.0 +
               (fVar265 * fVar252 - fVar134 * fVar197) * 0.0 +
               (fVar134 * fVar149 - fVar203 * fVar252);
          auVar274._12_4_ =
               (fVar219 * fVar205 - fVar249 * fVar150) * 0.0 +
               (fVar249 * fVar256 - fVar135 * fVar205) * 0.0 +
               (fVar135 * fVar150 - fVar219 * fVar256);
          auVar129._8_4_ = fVar196;
          auVar129._12_4_ = fVar235;
          auVar51 = maxps(auVar129,auVar274);
          bVar27 = auVar51._0_4_ <= 0.0 && bVar27;
          auVar130._0_4_ = -(uint)bVar27;
          bVar28 = auVar51._4_4_ <= 0.0 && bVar28;
          auVar130._4_4_ = -(uint)bVar28;
          bVar26 = auVar51._8_4_ <= 0.0 && bVar26;
          auVar130._8_4_ = -(uint)bVar26;
          bVar25 = auVar51._12_4_ <= 0.0 && bVar25;
          auVar130._12_4_ = -(uint)bVar25;
          iVar33 = movmskps((int)pauVar31,auVar130);
          if (iVar33 == 0) {
LAB_0030a21f:
            auVar119._8_8_ = uStack_380;
            auVar119._0_8_ = local_388;
          }
          else {
            fVar203 = fVar121 * fVar244 - fVar151 * fVar172;
            fVar219 = fVar137 * fVar251 - fVar165 * fVar190;
            fVar247 = fVar149 * fVar263 - fVar197 * fVar191;
            fVar255 = fVar150 * fVar267 - fVar205 * fVar193;
            fVar162 = fVar151 * fVar253 - fVar244 * fVar245;
            fVar165 = fVar165 * fVar123 - fVar251 * fVar248;
            fVar208 = fVar197 * fVar163 - fVar263 * fVar252;
            fVar197 = fVar205 * fVar168 - fVar267 * fVar256;
            fVar121 = fVar245 * fVar172 - fVar121 * fVar253;
            fVar205 = fVar248 * fVar190 - fVar137 * fVar123;
            fVar244 = fVar252 * fVar191 - fVar149 * fVar163;
            fVar251 = fVar256 * fVar193 - fVar150 * fVar168;
            auVar118._0_4_ = fVar162 * 0.0 + fVar121;
            auVar118._4_4_ = fVar165 * 0.0 + fVar205;
            auVar118._8_4_ = fVar208 * 0.0 + fVar244;
            auVar118._12_4_ = fVar197 * 0.0 + fVar251;
            auVar188._0_4_ = fVar203 * 0.0 + auVar118._0_4_;
            auVar188._4_4_ = fVar219 * 0.0 + auVar118._4_4_;
            auVar188._8_4_ = fVar247 * 0.0 + auVar118._8_4_;
            auVar188._12_4_ = fVar255 * 0.0 + auVar118._12_4_;
            auVar51 = rcpps(auVar118,auVar188);
            fVar137 = auVar51._0_4_;
            fVar149 = auVar51._4_4_;
            fVar150 = auVar51._8_4_;
            fVar151 = auVar51._12_4_;
            fVar137 = (1.0 - auVar188._0_4_ * fVar137) * fVar137 + fVar137;
            fVar149 = (1.0 - auVar188._4_4_ * fVar149) * fVar149 + fVar149;
            fVar150 = (1.0 - auVar188._8_4_ * fVar150) * fVar150 + fVar150;
            fVar151 = (1.0 - auVar188._12_4_ * fVar151) * fVar151 + fVar151;
            fVar162 = (fVar220 * fVar121 + fVar152 * fVar162 + fVar164 * fVar203) * fVar137;
            fVar165 = (fVar221 * fVar205 + fVar166 * fVar165 + fVar169 * fVar219) * fVar149;
            aVar202.v[1] = fVar165;
            aVar202.v[0] = fVar162;
            fVar208 = (fVar222 * fVar244 + fVar153 * fVar208 + fVar171 * fVar247) * fVar150;
            fVar197 = (fVar234 * fVar251 + fVar167 * fVar197 + fVar136 * fVar255) * fVar151;
            fVar121 = *(float *)(ray + k * 4 + 0x80);
            bVar27 = (fVar114 <= fVar162 && fVar162 <= fVar121) && bVar27;
            auVar147._0_4_ = -(uint)bVar27;
            bVar28 = (fVar114 <= fVar165 && fVar165 <= fVar121) && bVar28;
            auVar147._4_4_ = -(uint)bVar28;
            bVar26 = (fVar114 <= fVar208 && fVar208 <= fVar121) && bVar26;
            auVar147._8_4_ = -(uint)bVar26;
            bVar25 = (fVar114 <= fVar197 && fVar197 <= fVar121) && bVar25;
            auVar147._12_4_ = -(uint)bVar25;
            iVar33 = movmskps(iVar33,auVar147);
            if (iVar33 == 0) goto LAB_0030a21f;
            auVar148._0_8_ =
                 CONCAT44(-(uint)(auVar188._4_4_ != 0.0 && bVar28),
                          -(uint)(auVar188._0_4_ != 0.0 && bVar27));
            auVar148._8_4_ = -(uint)(auVar188._8_4_ != 0.0 && bVar26);
            auVar148._12_4_ = -(uint)(auVar188._12_4_ != 0.0 && bVar25);
            iVar33 = movmskps(iVar33,auVar148);
            auVar119._8_8_ = uStack_380;
            auVar119._0_8_ = local_388;
            if (iVar33 != 0) {
              fVar194 = fVar194 * fVar137;
              fVar195 = fVar195 * fVar149;
              fVar196 = fVar196 * fVar150;
              fVar235 = fVar235 * fVar151;
              auVar73._0_4_ = ~uVar44 & (uint)fVar194;
              auVar73._4_4_ = ~uVar45 & (uint)fVar195;
              auVar73._8_4_ = ~uVar46 & (uint)fVar196;
              auVar73._12_4_ = ~uVar47 & (uint)fVar235;
              auVar211._0_4_ = (uint)(1.0 - fVar194) & uVar44;
              auVar211._4_4_ = (uint)(1.0 - fVar195) & uVar45;
              auVar211._8_4_ = (uint)(1.0 - fVar196) & uVar46;
              auVar211._12_4_ = (uint)(1.0 - fVar235) & uVar47;
              aVar212 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)(auVar211 | auVar73);
              local_298 = (float)(~uVar44 & (uint)(auVar274._0_4_ * fVar137) |
                                 (uint)(1.0 - auVar274._0_4_ * fVar137) & uVar44);
              fStack_294 = (float)(~uVar45 & (uint)(auVar274._4_4_ * fVar149) |
                                  (uint)(1.0 - auVar274._4_4_ * fVar149) & uVar45);
              fStack_290 = (float)(~uVar46 & (uint)(auVar274._8_4_ * fVar150) |
                                  (uint)(1.0 - auVar274._8_4_ * fVar150) & uVar46);
              fStack_28c = (float)(~uVar47 & (uint)(auVar274._12_4_ * fVar151) |
                                  (uint)(1.0 - auVar274._12_4_ * fVar151) & uVar47);
              auVar119._8_4_ = auVar148._8_4_;
              auVar119._0_8_ = auVar148._0_8_;
              auVar119._12_4_ = auVar148._12_4_;
              aVar202.v[2] = fVar208;
              aVar202.v[3] = fVar197;
              aVar200 = aVar202;
            }
          }
          uVar35 = uVar40 & 0xffffffff;
          uVar44 = movmskps(iVar33,auVar119);
          if (uVar44 != 0) {
            fVar137 = (auVar242._0_4_ - auVar260._0_4_) * aVar212.v[0] + auVar260._0_4_;
            fVar149 = (auVar242._4_4_ - auVar260._4_4_) * aVar212.v[1] + auVar260._4_4_;
            fVar150 = (auVar242._8_4_ - auVar260._8_4_) * aVar212.v[2] + auVar260._8_4_;
            fVar151 = (auVar242._12_4_ - auVar260._12_4_) * aVar212.v[3] + auVar260._12_4_;
            fVar121 = *(float *)((long)local_310->ray_space + k * 4 + -0x10);
            bhit.valid.field_0._0_4_ =
                 -(uint)(fVar121 * (fVar137 + fVar137) < aVar200.v[0]) & auVar119._0_4_;
            bhit.valid.field_0._4_4_ =
                 -(uint)(fVar121 * (fVar149 + fVar149) < aVar200.v[1]) & auVar119._4_4_;
            bhit.valid.field_0._8_4_ =
                 -(uint)(fVar121 * (fVar150 + fVar150) < aVar200.v[2]) & auVar119._8_4_;
            bhit.valid.field_0._12_4_ =
                 -(uint)(fVar121 * (fVar151 + fVar151) < aVar200.v[3]) & auVar119._12_4_;
            uVar44 = movmskps((int)local_310,(undefined1  [16])bhit.valid.field_0);
            if (uVar44 != 0) {
              local_298 = local_298 + local_298 + -1.0;
              fStack_294 = fStack_294 + fStack_294 + -1.0;
              fStack_290 = fStack_290 + fStack_290 + -1.0;
              fStack_28c = fStack_28c + fStack_28c + -1.0;
              bhit.curve3D.v0.field_0._0_8_ = CONCAT44(fStack_344,local_348);
              bhit.curve3D.v0.field_0._8_8_ = CONCAT44(fStack_33c,fStack_340);
              bhit.curve3D.v1.field_0._0_8_ = CONCAT44(fStack_354,local_358);
              bhit.curve3D.v1.field_0._8_8_ = CONCAT44(fStack_34c,fStack_350);
              bhit.curve3D.v2.field_0._0_8_ = CONCAT44(fStack_364,local_368);
              bhit.curve3D.v2.field_0._8_8_ = CONCAT44(fStack_35c,fStack_360);
              bhit.curve3D.v3.field_0._0_8_ = CONCAT44(fStack_374,local_378);
              bhit.curve3D.v3.field_0._8_8_ = CONCAT44(fStack_36c,fStack_370);
              pGVar36 = (context->scene->geometries).items[local_390].ptr;
              if ((pGVar36->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                bVar32 = 0;
              }
              else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                      (bVar32 = 1, pGVar36->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar121 = (float)bhit.i;
                bhit.vu.field_0.v[0] = (fVar121 + aVar212.v[0] + 0.0) * local_88;
                bhit.vu.field_0.v[1] = (fVar121 + aVar212.v[1] + 1.0) * fStack_84;
                bhit.vu.field_0.v[2] = (fVar121 + aVar212.v[2] + 2.0) * fStack_80;
                bhit.vu.field_0.v[3] = (fVar121 + aVar212.v[3] + 3.0) * fStack_7c;
                bhit.vv.field_0._0_8_ = CONCAT44(fStack_294,local_298);
                bhit.vv.field_0._8_8_ = CONCAT44(fStack_28c,fStack_290);
                bhit.vt.field_0 = aVar200;
                uVar39 = (ulong)(byte)uVar44;
                uVar35 = 0;
                if (uVar39 != 0) {
                  for (; ((byte)uVar44 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                  }
                }
                auVar51 = *local_318;
                fVar121 = local_348;
                fVar137 = fStack_344;
                fVar149 = fStack_340;
                fVar150 = local_358;
                fVar151 = fStack_354;
                fVar162 = fStack_350;
                fVar165 = local_368;
                fVar208 = fStack_364;
                fVar197 = fStack_360;
                fVar203 = local_378;
                fVar205 = fStack_374;
                fVar219 = fStack_370;
                bhit.U.field_0 = aVar212;
                bhit.V.field_0.v[0] = local_298;
                bhit.V.field_0.v[1] = fStack_294;
                bhit.V.field_0.v[2] = fStack_290;
                bhit.V.field_0.v[3] = fStack_28c;
                bhit.T.field_0 = aVar200;
                bhit.N = iVar6;
                while (uVar39 != 0) {
                  local_e8 = bhit.vu.field_0.v[uVar35];
                  uVar43 = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_d8 = bhit.vv.field_0.v[uVar35];
                  *(float *)(ray + k * 4 + 0x80) = bhit.vt.field_0.v[uVar35];
                  fVar244 = 1.0 - local_e8;
                  fVar220 = local_e8 * 3.0;
                  fVar234 = ((fVar220 + 2.0) * (fVar244 + fVar244) + fVar244 * -3.0 * fVar244) * 0.5
                  ;
                  fVar221 = (local_e8 * local_e8 + fVar244 * -2.0 * local_e8) * 0.5;
                  fVar222 = (local_e8 * fVar220 + (fVar220 + -5.0) * (local_e8 + local_e8)) * 0.5;
                  args.context = context->user;
                  fVar220 = (local_e8 * (fVar244 + fVar244) - fVar244 * fVar244) * 0.5;
                  local_118 = fVar220 * fVar121 +
                              fVar222 * fVar150 + fVar234 * fVar165 + fVar221 * fVar203;
                  local_108 = fVar220 * fVar137 +
                              fVar222 * fVar151 + fVar234 * fVar208 + fVar221 * fVar205;
                  local_f8 = fVar220 * fVar149 +
                             fVar222 * fVar162 + fVar234 * fVar197 + fVar221 * fVar219;
                  fStack_114 = local_118;
                  fStack_110 = local_118;
                  fStack_10c = local_118;
                  fStack_104 = local_108;
                  fStack_100 = local_108;
                  fStack_fc = local_108;
                  fStack_f4 = local_f8;
                  fStack_f0 = local_f8;
                  fStack_ec = local_f8;
                  fStack_e4 = local_e8;
                  fStack_e0 = local_e8;
                  fStack_dc = local_e8;
                  fStack_d4 = local_d8;
                  fStack_d0 = local_d8;
                  fStack_cc = local_d8;
                  local_c8 = CONCAT44(uStack_74,local_78);
                  uStack_c0 = CONCAT44(uStack_6c,uStack_70);
                  local_b8 = CONCAT44(uStack_64,local_68);
                  uStack_b0 = CONCAT44(uStack_5c,uStack_60);
                  local_a8 = (args.context)->instID[0];
                  uStack_a4 = local_a8;
                  uStack_a0 = local_a8;
                  uStack_9c = local_a8;
                  local_98 = (args.context)->instPrimID[0];
                  uStack_94 = local_98;
                  uStack_90 = local_98;
                  uStack_8c = local_98;
                  args.valid = (int *)local_3a8;
                  args.geometryUserPtr = pGVar36->userPtr;
                  args.hit = (RTCHitN *)&local_118;
                  args.N = 4;
                  p_Var29 = pGVar36->occlusionFilterN;
                  local_3a8 = auVar51;
                  args.ray = (RTCRayN *)ray;
                  if (p_Var29 != (RTCFilterFunctionN)0x0) {
                    p_Var29 = (RTCFilterFunctionN)(*p_Var29)(&args);
                    fVar121 = local_348;
                    fVar137 = fStack_344;
                    fVar149 = fStack_340;
                    fVar150 = local_358;
                    fVar151 = fStack_354;
                    fVar162 = fStack_350;
                    fVar165 = local_368;
                    fVar208 = fStack_364;
                    fVar197 = fStack_360;
                    fVar203 = local_378;
                    fVar205 = fStack_374;
                    fVar219 = fStack_370;
                  }
                  auVar106._0_4_ = -(uint)(local_3a8._0_4_ == 0);
                  auVar106._4_4_ = -(uint)(local_3a8._4_4_ == 0);
                  auVar106._8_4_ = -(uint)(local_3a8._8_4_ == 0);
                  auVar106._12_4_ = -(uint)(local_3a8._12_4_ == 0);
                  uVar44 = movmskps((int)p_Var29,auVar106);
                  pRVar30 = (RTCRayN *)(ulong)(uVar44 ^ 0xf);
                  if ((uVar44 ^ 0xf) == 0) {
                    auVar106 = auVar106 ^ _DAT_01f46b70;
                  }
                  else {
                    p_Var29 = context->args->filter;
                    if ((p_Var29 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar36->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var29)(&args);
                      fVar121 = local_348;
                      fVar137 = fStack_344;
                      fVar149 = fStack_340;
                      fVar150 = local_358;
                      fVar151 = fStack_354;
                      fVar162 = fStack_350;
                      fVar165 = local_368;
                      fVar208 = fStack_364;
                      fVar197 = fStack_360;
                      fVar203 = local_378;
                      fVar205 = fStack_374;
                      fVar219 = fStack_370;
                    }
                    auVar74._0_4_ = -(uint)(local_3a8._0_4_ == 0);
                    auVar74._4_4_ = -(uint)(local_3a8._4_4_ == 0);
                    auVar74._8_4_ = -(uint)(local_3a8._8_4_ == 0);
                    auVar74._12_4_ = -(uint)(local_3a8._12_4_ == 0);
                    auVar106 = auVar74 ^ _DAT_01f46b70;
                    *(undefined1 (*) [16])(args.ray + 0x80) =
                         ~auVar74 & _DAT_01f45a40 |
                         *(undefined1 (*) [16])(args.ray + 0x80) & auVar74;
                    pRVar30 = args.ray;
                  }
                  auVar107._0_4_ = auVar106._0_4_ << 0x1f;
                  auVar107._4_4_ = auVar106._4_4_ << 0x1f;
                  auVar107._8_4_ = auVar106._8_4_ << 0x1f;
                  auVar107._12_4_ = auVar106._12_4_ << 0x1f;
                  iVar33 = movmskps((int)pRVar30,auVar107);
                  if (iVar33 != 0) {
                    bVar32 = 1;
                    goto LAB_0030a20b;
                  }
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar43;
                  uVar39 = uVar39 ^ 1L << (uVar35 & 0x3f);
                  uVar35 = 0;
                  if (uVar39 != 0) {
                    for (; (uVar39 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                    }
                  }
                }
                bVar32 = 0;
              }
LAB_0030a20b:
              uVar44 = CONCAT31((int3)(uVar40 >> 8),(byte)uVar40 | bVar32);
              pauVar31 = (undefined1 (*) [16])(ulong)uVar44;
              uVar35 = (ulong)uVar44;
              goto LAB_0030a216;
            }
          }
          pauVar31 = (undefined1 (*) [16])(ulong)uVar44;
        }
LAB_0030a216:
        uVar40 = uVar35;
      }
    }
    if ((uVar40 & 1) != 0) break;
    fVar133 = *(float *)(ray + k * 4 + 0x80);
    auVar105._4_4_ = -(uint)(fStack_44 <= fVar133);
    auVar105._0_4_ = -(uint)(local_48 <= fVar133);
    auVar105._8_4_ = -(uint)(fStack_40 <= fVar133);
    auVar105._12_4_ = -(uint)(fStack_3c <= fVar133);
    uVar44 = movmskps(uVar43,auVar105);
    uVar42 = (ulong)((uint)uVar41 & uVar44);
  }
  return uVar42 != 0;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }